

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong uVar32;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar86 [32];
  int iVar87;
  float t1;
  float fVar88;
  undefined4 uVar89;
  float fVar91;
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vfloat4 b0;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  vfloat4 b0_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  vfloat4 a0_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar197;
  float fVar198;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar199;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar212;
  float fVar213;
  vfloat4 a0_1;
  float fVar214;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar221;
  float fVar222;
  vfloat4 a0;
  float fVar223;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 in_ZMM15 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_33c;
  undefined1 local_338 [16];
  ulong local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  RTCFilterFunctionNArguments local_2c8;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint auStack_168 [4];
  undefined8 local_158;
  float local_150;
  undefined8 local_14c;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  uint uStack_d8;
  float afStack_d4 [7];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar26;
  undefined1 auVar59 [32];
  undefined1 auVar61 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar228 [32];
  
  PVar4 = prim[1];
  uVar32 = (ulong)(byte)PVar4;
  fVar202 = *(float *)(prim + uVar32 * 0x19 + 0x12);
  auVar46 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar32 * 0x19 + 6));
  fVar113 = fVar202 * auVar46._0_4_;
  fVar88 = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar32 * 4 + 6);
  auVar57 = vpmovsxbd_avx2(auVar33);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar32 * 5 + 6);
  auVar55 = vpmovsxbd_avx2(auVar44);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar32 * 6 + 6);
  auVar62 = vpmovsxbd_avx2(auVar43);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar32 * 0xb + 6);
  auVar69 = vpmovsxbd_avx2(auVar42);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar53 = vpmovsxbd_avx2(auVar41);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vcvtdq2ps_avx(auVar53);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar32 + 6);
  auVar56 = vpmovsxbd_avx2(auVar40);
  auVar56 = vcvtdq2ps_avx(auVar56);
  uVar31 = (ulong)(uint)((int)(uVar32 * 9) * 2);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar63 = vpmovsxbd_avx2(auVar39);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar31 + uVar32 + 6);
  auVar64 = vpmovsxbd_avx2(auVar38);
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar25 = (ulong)(uint)((int)(uVar32 * 5) << 2);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar25 + 6);
  auVar54 = vpmovsxbd_avx2(auVar35);
  auVar65 = vcvtdq2ps_avx(auVar54);
  auVar120._4_4_ = fVar88;
  auVar120._0_4_ = fVar88;
  auVar120._8_4_ = fVar88;
  auVar120._12_4_ = fVar88;
  auVar120._16_4_ = fVar88;
  auVar120._20_4_ = fVar88;
  auVar120._24_4_ = fVar88;
  auVar120._28_4_ = fVar88;
  auVar49 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar243 = ZEXT3264(auVar49);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar244 = ZEXT3264(auVar50);
  auVar66 = ZEXT1632(CONCAT412(fVar202 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar202 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar202 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar88))));
  auVar51 = vpermps_avx512vl(auVar49,auVar66);
  auVar52 = vpermps_avx512vl(auVar50,auVar66);
  fVar88 = auVar52._0_4_;
  fVar197 = auVar52._4_4_;
  auVar66._4_4_ = fVar197 * auVar62._4_4_;
  auVar66._0_4_ = fVar88 * auVar62._0_4_;
  fVar198 = auVar52._8_4_;
  auVar66._8_4_ = fVar198 * auVar62._8_4_;
  fVar199 = auVar52._12_4_;
  auVar66._12_4_ = fVar199 * auVar62._12_4_;
  fVar200 = auVar52._16_4_;
  auVar66._16_4_ = fVar200 * auVar62._16_4_;
  fVar201 = auVar52._20_4_;
  auVar66._20_4_ = fVar201 * auVar62._20_4_;
  fVar91 = auVar52._24_4_;
  auVar66._24_4_ = fVar91 * auVar62._24_4_;
  auVar66._28_4_ = auVar53._28_4_;
  auVar53._4_4_ = auVar56._4_4_ * fVar197;
  auVar53._0_4_ = auVar56._0_4_ * fVar88;
  auVar53._8_4_ = auVar56._8_4_ * fVar198;
  auVar53._12_4_ = auVar56._12_4_ * fVar199;
  auVar53._16_4_ = auVar56._16_4_ * fVar200;
  auVar53._20_4_ = auVar56._20_4_ * fVar201;
  auVar53._24_4_ = auVar56._24_4_ * fVar91;
  auVar53._28_4_ = auVar54._28_4_;
  auVar54._4_4_ = auVar65._4_4_ * fVar197;
  auVar54._0_4_ = auVar65._0_4_ * fVar88;
  auVar54._8_4_ = auVar65._8_4_ * fVar198;
  auVar54._12_4_ = auVar65._12_4_ * fVar199;
  auVar54._16_4_ = auVar65._16_4_ * fVar200;
  auVar54._20_4_ = auVar65._20_4_ * fVar201;
  auVar54._24_4_ = auVar65._24_4_ * fVar91;
  auVar54._28_4_ = auVar52._28_4_;
  auVar33 = vfmadd231ps_fma(auVar66,auVar51,auVar55);
  auVar44 = vfmadd231ps_fma(auVar53,auVar51,auVar70);
  auVar43 = vfmadd231ps_fma(auVar54,auVar64,auVar51);
  auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar120,auVar57);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar120,auVar69);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar63,auVar120);
  auVar133._4_4_ = fVar113;
  auVar133._0_4_ = fVar113;
  auVar133._8_4_ = fVar113;
  auVar133._12_4_ = fVar113;
  auVar133._16_4_ = fVar113;
  auVar133._20_4_ = fVar113;
  auVar133._24_4_ = fVar113;
  auVar133._28_4_ = fVar113;
  auVar54 = ZEXT1632(CONCAT412(fVar202 * auVar46._12_4_,
                               CONCAT48(fVar202 * auVar46._8_4_,
                                        CONCAT44(fVar202 * auVar46._4_4_,fVar113))));
  auVar53 = vpermps_avx512vl(auVar49,auVar54);
  auVar54 = vpermps_avx512vl(auVar50,auVar54);
  fVar202 = auVar54._0_4_;
  auVar238._0_4_ = fVar202 * auVar62._0_4_;
  fVar88 = auVar54._4_4_;
  auVar238._4_4_ = fVar88 * auVar62._4_4_;
  fVar197 = auVar54._8_4_;
  auVar238._8_4_ = fVar197 * auVar62._8_4_;
  fVar198 = auVar54._12_4_;
  auVar238._12_4_ = fVar198 * auVar62._12_4_;
  fVar199 = auVar54._16_4_;
  auVar238._16_4_ = fVar199 * auVar62._16_4_;
  fVar200 = auVar54._20_4_;
  auVar238._20_4_ = fVar200 * auVar62._20_4_;
  fVar201 = auVar54._24_4_;
  auVar238._28_36_ = in_ZMM15._28_36_;
  auVar238._24_4_ = fVar201 * auVar62._24_4_;
  auVar49._4_4_ = auVar56._4_4_ * fVar88;
  auVar49._0_4_ = auVar56._0_4_ * fVar202;
  auVar49._8_4_ = auVar56._8_4_ * fVar197;
  auVar49._12_4_ = auVar56._12_4_ * fVar198;
  auVar49._16_4_ = auVar56._16_4_ * fVar199;
  auVar49._20_4_ = auVar56._20_4_ * fVar200;
  auVar49._24_4_ = auVar56._24_4_ * fVar201;
  auVar49._28_4_ = auVar62._28_4_;
  auVar56._4_4_ = auVar65._4_4_ * fVar88;
  auVar56._0_4_ = auVar65._0_4_ * fVar202;
  auVar56._8_4_ = auVar65._8_4_ * fVar197;
  auVar56._12_4_ = auVar65._12_4_ * fVar198;
  auVar56._16_4_ = auVar65._16_4_ * fVar199;
  auVar56._20_4_ = auVar65._20_4_ * fVar200;
  auVar56._24_4_ = auVar65._24_4_ * fVar201;
  auVar56._28_4_ = auVar54._28_4_;
  auVar42 = vfmadd231ps_fma(auVar238._0_32_,auVar53,auVar55);
  auVar41 = vfmadd231ps_fma(auVar49,auVar53,auVar70);
  auVar40 = vfmadd231ps_fma(auVar56,auVar53,auVar64);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar133,auVar57);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar133,auVar69);
  auVar71._8_4_ = 0x7fffffff;
  auVar71._0_8_ = 0x7fffffff7fffffff;
  auVar71._12_4_ = 0x7fffffff;
  auVar71._16_4_ = 0x7fffffff;
  auVar71._20_4_ = 0x7fffffff;
  auVar71._24_4_ = 0x7fffffff;
  auVar71._28_4_ = 0x7fffffff;
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar133,auVar63);
  auVar57 = vandps_avx(ZEXT1632(auVar33),auVar71);
  auVar73._8_4_ = 0x219392ef;
  auVar73._0_8_ = 0x219392ef219392ef;
  auVar73._12_4_ = 0x219392ef;
  auVar73._16_4_ = 0x219392ef;
  auVar73._20_4_ = 0x219392ef;
  auVar73._24_4_ = 0x219392ef;
  auVar73._28_4_ = 0x219392ef;
  uVar31 = vcmpps_avx512vl(auVar57,auVar73,1);
  bVar10 = (bool)((byte)uVar31 & 1);
  auVar50._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar33._0_4_;
  bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar33._4_4_;
  bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar33._8_4_;
  bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar50._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar33._12_4_;
  auVar50._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar50._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar50._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar50._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar57 = vandps_avx(ZEXT1632(auVar44),auVar71);
  uVar31 = vcmpps_avx512vl(auVar57,auVar73,1);
  bVar10 = (bool)((byte)uVar31 & 1);
  auVar51._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._0_4_;
  bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._4_4_;
  bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._8_4_;
  bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar51._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._12_4_;
  auVar51._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar51._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar51._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar51._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar57 = vandps_avx(ZEXT1632(auVar43),auVar71);
  uVar31 = vcmpps_avx512vl(auVar57,auVar73,1);
  bVar10 = (bool)((byte)uVar31 & 1);
  auVar57._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._0_4_;
  bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._4_4_;
  bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._8_4_;
  bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._12_4_;
  auVar57._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar57._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar57._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar57._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar55 = vrcp14ps_avx512vl(auVar50);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = &DAT_3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar72._16_4_ = 0x3f800000;
  auVar72._20_4_ = 0x3f800000;
  auVar72._24_4_ = 0x3f800000;
  auVar72._28_4_ = 0x3f800000;
  auVar33 = vfnmadd213ps_fma(auVar50,auVar55,auVar72);
  auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar55,auVar55);
  auVar55 = vrcp14ps_avx512vl(auVar51);
  auVar44 = vfnmadd213ps_fma(auVar51,auVar55,auVar72);
  auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar55,auVar55);
  auVar55 = vrcp14ps_avx512vl(auVar57);
  auVar43 = vfnmadd213ps_fma(auVar57,auVar55,auVar72);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar55,auVar55);
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 7 + 6));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,ZEXT1632(auVar42));
  auVar63._4_4_ = auVar33._4_4_ * auVar57._4_4_;
  auVar63._0_4_ = auVar33._0_4_ * auVar57._0_4_;
  auVar63._8_4_ = auVar33._8_4_ * auVar57._8_4_;
  auVar63._12_4_ = auVar33._12_4_ * auVar57._12_4_;
  auVar63._16_4_ = auVar57._16_4_ * 0.0;
  auVar63._20_4_ = auVar57._20_4_ * 0.0;
  auVar63._24_4_ = auVar57._24_4_ * 0.0;
  auVar63._28_4_ = auVar57._28_4_;
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 9 + 6));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,ZEXT1632(auVar42));
  auVar56 = vpbroadcastd_avx512vl();
  auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar68._0_4_ = auVar33._0_4_ * auVar57._0_4_;
  auVar68._4_4_ = auVar33._4_4_ * auVar57._4_4_;
  auVar68._8_4_ = auVar33._8_4_ * auVar57._8_4_;
  auVar68._12_4_ = auVar33._12_4_ * auVar57._12_4_;
  auVar68._16_4_ = auVar57._16_4_ * 0.0;
  auVar68._20_4_ = auVar57._20_4_ * 0.0;
  auVar68._24_4_ = auVar57._24_4_ * 0.0;
  auVar68._28_4_ = 0;
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar32 * -2 + 6));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,ZEXT1632(auVar41));
  auVar64._4_4_ = auVar44._4_4_ * auVar57._4_4_;
  auVar64._0_4_ = auVar44._0_4_ * auVar57._0_4_;
  auVar64._8_4_ = auVar44._8_4_ * auVar57._8_4_;
  auVar64._12_4_ = auVar44._12_4_ * auVar57._12_4_;
  auVar64._16_4_ = auVar57._16_4_ * 0.0;
  auVar64._20_4_ = auVar57._20_4_ * 0.0;
  auVar64._24_4_ = auVar57._24_4_ * 0.0;
  auVar64._28_4_ = auVar57._28_4_;
  auVar57 = vcvtdq2ps_avx(auVar55);
  auVar57 = vsubps_avx(auVar57,ZEXT1632(auVar41));
  auVar67._0_4_ = auVar44._0_4_ * auVar57._0_4_;
  auVar67._4_4_ = auVar44._4_4_ * auVar57._4_4_;
  auVar67._8_4_ = auVar44._8_4_ * auVar57._8_4_;
  auVar67._12_4_ = auVar44._12_4_ * auVar57._12_4_;
  auVar67._16_4_ = auVar57._16_4_ * 0.0;
  auVar67._20_4_ = auVar57._20_4_ * 0.0;
  auVar67._24_4_ = auVar57._24_4_ * 0.0;
  auVar67._28_4_ = 0;
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 + uVar32 + 6));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,ZEXT1632(auVar40));
  auVar65._4_4_ = auVar57._4_4_ * auVar43._4_4_;
  auVar65._0_4_ = auVar57._0_4_ * auVar43._0_4_;
  auVar65._8_4_ = auVar57._8_4_ * auVar43._8_4_;
  auVar65._12_4_ = auVar57._12_4_ * auVar43._12_4_;
  auVar65._16_4_ = auVar57._16_4_ * 0.0;
  auVar65._20_4_ = auVar57._20_4_ * 0.0;
  auVar65._24_4_ = auVar57._24_4_ * 0.0;
  auVar65._28_4_ = auVar57._28_4_;
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0x17 + 6));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,ZEXT1632(auVar40));
  auVar52._0_4_ = auVar43._0_4_ * auVar57._0_4_;
  auVar52._4_4_ = auVar43._4_4_ * auVar57._4_4_;
  auVar52._8_4_ = auVar43._8_4_ * auVar57._8_4_;
  auVar52._12_4_ = auVar43._12_4_ * auVar57._12_4_;
  auVar52._16_4_ = auVar57._16_4_ * 0.0;
  auVar52._20_4_ = auVar57._20_4_ * 0.0;
  auVar52._24_4_ = auVar57._24_4_ * 0.0;
  auVar52._28_4_ = 0;
  auVar57 = vpminsd_avx2(auVar63,auVar68);
  auVar55 = vpminsd_avx2(auVar64,auVar67);
  auVar57 = vmaxps_avx(auVar57,auVar55);
  auVar55 = vpminsd_avx2(auVar65,auVar52);
  uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar62._4_4_ = uVar89;
  auVar62._0_4_ = uVar89;
  auVar62._8_4_ = uVar89;
  auVar62._12_4_ = uVar89;
  auVar62._16_4_ = uVar89;
  auVar62._20_4_ = uVar89;
  auVar62._24_4_ = uVar89;
  auVar62._28_4_ = uVar89;
  auVar55 = vmaxps_avx512vl(auVar55,auVar62);
  auVar57 = vmaxps_avx(auVar57,auVar55);
  auVar55._8_4_ = 0x3f7ffffa;
  auVar55._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar55._12_4_ = 0x3f7ffffa;
  auVar55._16_4_ = 0x3f7ffffa;
  auVar55._20_4_ = 0x3f7ffffa;
  auVar55._24_4_ = 0x3f7ffffa;
  auVar55._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar57,auVar55);
  auVar57 = vpmaxsd_avx2(auVar63,auVar68);
  auVar55 = vpmaxsd_avx2(auVar64,auVar67);
  auVar57 = vminps_avx(auVar57,auVar55);
  auVar55 = vpmaxsd_avx2(auVar65,auVar52);
  fVar202 = (ray->super_RayK<1>).tfar;
  auVar69._4_4_ = fVar202;
  auVar69._0_4_ = fVar202;
  auVar69._8_4_ = fVar202;
  auVar69._12_4_ = fVar202;
  auVar69._16_4_ = fVar202;
  auVar69._20_4_ = fVar202;
  auVar69._24_4_ = fVar202;
  auVar69._28_4_ = fVar202;
  auVar55 = vminps_avx512vl(auVar55,auVar69);
  auVar57 = vminps_avx(auVar57,auVar55);
  auVar70._8_4_ = 0x3f800003;
  auVar70._0_8_ = 0x3f8000033f800003;
  auVar70._12_4_ = 0x3f800003;
  auVar70._16_4_ = 0x3f800003;
  auVar70._20_4_ = 0x3f800003;
  auVar70._24_4_ = 0x3f800003;
  auVar70._28_4_ = 0x3f800003;
  auVar57 = vmulps_avx512vl(auVar57,auVar70);
  uVar13 = vpcmpgtd_avx512vl(auVar56,_DAT_0205a920);
  uVar12 = vcmpps_avx512vl(local_b8,auVar57,2);
  if ((byte)((byte)uVar12 & (byte)uVar13) == 0) {
    return;
  }
  uVar31 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
  auVar86._16_16_ = auVar57._16_16_;
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar238 = ZEXT1664(auVar33);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar33);
  auVar86._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar240 = ZEXT1664(auVar86._0_16_);
LAB_01d5e2a1:
  lVar29 = 0;
  for (uVar25 = uVar31; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar30 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar30].ptr;
  local_320 = (ulong)*(uint *)(prim + lVar29 * 4 + 6);
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar29 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar33 = *(undefined1 (*) [16])(_Var9 + uVar25 * (long)pvVar8);
  auVar44 = *(undefined1 (*) [16])(_Var9 + (uVar25 + 1) * (long)pvVar8);
  auVar43 = *(undefined1 (*) [16])(_Var9 + (uVar25 + 2) * (long)pvVar8);
  auVar42 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar25 + 3));
  lVar29 = *(long *)&pGVar6[1].time_range.upper;
  auVar41 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * uVar25);
  auVar40 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar25 + 1));
  auVar39 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar25 + 2));
  uVar31 = uVar31 - 1 & uVar31;
  auVar38 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar25 + 3));
  if (uVar31 != 0) {
    uVar32 = uVar31 - 1 & uVar31;
    for (uVar25 = uVar31; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    }
    if (uVar32 != 0) {
      for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar59._16_16_ = auVar86._16_16_;
  auVar59._0_16_ = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
  auVar34 = vmulps_avx512vl(auVar38,auVar59._0_16_);
  auVar229._8_4_ = 0x3e2aaaab;
  auVar229._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar229._12_4_ = 0x3e2aaaab;
  auVar35 = vfmadd213ps_fma(auVar229,auVar39,auVar34);
  auVar224._8_4_ = 0x3f2aaaab;
  auVar224._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar224._12_4_ = 0x3f2aaaab;
  auVar35 = vfmadd231ps_fma(auVar35,auVar40,auVar224);
  auVar46 = vfmadd231ps_fma(auVar35,auVar41,auVar229);
  auVar47 = auVar238._0_16_;
  auVar35 = vfmadd231ps_avx512vl(auVar34,auVar39,auVar47);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar40,auVar59._0_16_);
  auVar36 = vfnmadd231ps_avx512vl(auVar35,auVar41,auVar47);
  auVar34 = vmulps_avx512vl(auVar42,auVar59._0_16_);
  auVar35 = vfmadd213ps_fma(auVar229,auVar43,auVar34);
  auVar35 = vfmadd231ps_fma(auVar35,auVar44,auVar224);
  auVar35 = vfmadd231ps_fma(auVar35,auVar33,auVar229);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar43,auVar47);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar44,auVar59._0_16_);
  auVar37 = vfnmadd231ps_avx512vl(auVar34,auVar33,auVar47);
  auVar100._0_4_ = auVar38._0_4_ * 0.16666667;
  auVar100._4_4_ = auVar38._4_4_ * 0.16666667;
  auVar100._8_4_ = auVar38._8_4_ * 0.16666667;
  auVar100._12_4_ = auVar38._12_4_ * 0.16666667;
  auVar34 = vfmadd231ps_fma(auVar100,auVar39,auVar224);
  auVar34 = vfmadd231ps_fma(auVar34,auVar40,auVar229);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar41,auVar59._0_16_);
  auVar38 = vmulps_avx512vl(auVar38,auVar47);
  auVar39 = vfmadd231ps_avx512vl(auVar38,auVar59._0_16_,auVar39);
  auVar40 = vfnmadd231ps_avx512vl(auVar39,auVar47,auVar40);
  auVar39 = vfnmadd231ps_avx512vl(auVar40,auVar59._0_16_,auVar41);
  auVar167._0_4_ = auVar42._0_4_ * 0.16666667;
  auVar167._4_4_ = auVar42._4_4_ * 0.16666667;
  auVar167._8_4_ = auVar42._8_4_ * 0.16666667;
  auVar167._12_4_ = auVar42._12_4_ * 0.16666667;
  auVar41 = vfmadd231ps_fma(auVar167,auVar43,auVar224);
  auVar41 = vfmadd231ps_fma(auVar41,auVar44,auVar229);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar33,auVar59._0_16_);
  auVar42 = vmulps_avx512vl(auVar42,auVar47);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar59._0_16_,auVar43);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar47,auVar44);
  auVar40 = vfnmadd231ps_avx512vl(auVar44,auVar59._0_16_,auVar33);
  auVar33 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar44 = vshufps_avx(auVar35,auVar35,0xc9);
  fVar199 = auVar36._0_4_;
  auVar135._0_4_ = fVar199 * auVar44._0_4_;
  fVar200 = auVar36._4_4_;
  auVar135._4_4_ = fVar200 * auVar44._4_4_;
  fVar201 = auVar36._8_4_;
  auVar135._8_4_ = fVar201 * auVar44._8_4_;
  fVar91 = auVar36._12_4_;
  auVar135._12_4_ = fVar91 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar135,auVar33,auVar35);
  auVar43 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar136._0_4_ = fVar199 * auVar44._0_4_;
  auVar136._4_4_ = fVar200 * auVar44._4_4_;
  auVar136._8_4_ = fVar201 * auVar44._8_4_;
  auVar136._12_4_ = fVar91 * auVar44._12_4_;
  auVar33 = vfmsub231ps_fma(auVar136,auVar33,auVar37);
  auVar42 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar44 = vshufps_avx(auVar41,auVar41,0xc9);
  fVar113 = auVar39._0_4_;
  auVar126._0_4_ = fVar113 * auVar44._0_4_;
  fVar123 = auVar39._4_4_;
  auVar126._4_4_ = fVar123 * auVar44._4_4_;
  fVar124 = auVar39._8_4_;
  auVar126._8_4_ = fVar124 * auVar44._8_4_;
  fVar125 = auVar39._12_4_;
  auVar126._12_4_ = fVar125 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar126,auVar33,auVar41);
  auVar41 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar168._0_4_ = auVar44._0_4_ * fVar113;
  auVar168._4_4_ = auVar44._4_4_ * fVar123;
  auVar168._8_4_ = auVar44._8_4_ * fVar124;
  auVar168._12_4_ = auVar44._12_4_ * fVar125;
  auVar44 = vfmsub231ps_fma(auVar168,auVar33,auVar40);
  auVar33 = vdpps_avx(auVar43,auVar43,0x7f);
  auVar40 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar88 = auVar33._0_4_;
  auVar58._4_28_ = auVar59._4_28_;
  auVar58._0_4_ = fVar88;
  auVar44 = vrsqrt14ss_avx512f(auVar59._0_16_,auVar58._0_16_);
  fVar202 = auVar44._0_4_;
  auVar44 = vdpps_avx(auVar43,auVar42,0x7f);
  fVar202 = fVar202 * 1.5 + fVar88 * -0.5 * fVar202 * fVar202 * fVar202;
  fVar203 = fVar202 * auVar43._0_4_;
  fVar212 = fVar202 * auVar43._4_4_;
  fVar213 = fVar202 * auVar43._8_4_;
  fVar214 = fVar202 * auVar43._12_4_;
  auVar179._0_4_ = auVar42._0_4_ * fVar88;
  auVar179._4_4_ = auVar42._4_4_ * fVar88;
  auVar179._8_4_ = auVar42._8_4_ * fVar88;
  auVar179._12_4_ = auVar42._12_4_ * fVar88;
  fVar88 = auVar44._0_4_;
  auVar146._0_4_ = fVar88 * auVar43._0_4_;
  auVar146._4_4_ = fVar88 * auVar43._4_4_;
  auVar146._8_4_ = fVar88 * auVar43._8_4_;
  auVar146._12_4_ = fVar88 * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar179,auVar146);
  auVar44 = vrcp14ss_avx512f(auVar59._0_16_,auVar58._0_16_);
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar44,ZEXT416(0x40000000));
  fVar197 = auVar44._0_4_ * auVar33._0_4_;
  auVar33 = vdpps_avx(auVar41,auVar41,0x7f);
  fVar198 = auVar33._0_4_;
  auVar61._16_16_ = auVar59._16_16_;
  auVar61._0_16_ = auVar59._0_16_;
  auVar60._4_28_ = auVar61._4_28_;
  auVar60._0_4_ = fVar198;
  auVar44 = vrsqrt14ss_avx512f(auVar59._0_16_,auVar60._0_16_);
  fVar88 = auVar44._0_4_;
  fVar88 = fVar88 * 1.5 + fVar198 * -0.5 * fVar88 * fVar88 * fVar88;
  auVar44 = vdpps_avx(auVar41,auVar40,0x7f);
  fVar215 = fVar88 * auVar41._0_4_;
  fVar221 = fVar88 * auVar41._4_4_;
  fVar222 = fVar88 * auVar41._8_4_;
  fVar223 = fVar88 * auVar41._12_4_;
  auVar137._0_4_ = fVar198 * auVar40._0_4_;
  auVar137._4_4_ = fVar198 * auVar40._4_4_;
  auVar137._8_4_ = fVar198 * auVar40._8_4_;
  auVar137._12_4_ = fVar198 * auVar40._12_4_;
  fVar198 = auVar44._0_4_;
  auVar127._0_4_ = fVar198 * auVar41._0_4_;
  auVar127._4_4_ = fVar198 * auVar41._4_4_;
  auVar127._8_4_ = fVar198 * auVar41._8_4_;
  auVar127._12_4_ = fVar198 * auVar41._12_4_;
  auVar42 = vsubps_avx(auVar137,auVar127);
  auVar44 = vrcp14ss_avx512f(auVar59._0_16_,auVar60._0_16_);
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar44,ZEXT416(0x40000000));
  fVar198 = auVar44._0_4_ * auVar33._0_4_;
  auVar33 = vshufps_avx(auVar46,auVar46,0xff);
  auVar152._0_4_ = fVar203 * auVar33._0_4_;
  auVar152._4_4_ = fVar212 * auVar33._4_4_;
  auVar152._8_4_ = fVar213 * auVar33._8_4_;
  auVar152._12_4_ = fVar214 * auVar33._12_4_;
  local_218 = vsubps_avx(auVar46,auVar152);
  auVar44 = vshufps_avx(auVar36,auVar36,0xff);
  auVar138._0_4_ = auVar44._0_4_ * fVar203 + auVar33._0_4_ * fVar202 * auVar43._0_4_ * fVar197;
  auVar138._4_4_ = auVar44._4_4_ * fVar212 + auVar33._4_4_ * fVar202 * auVar43._4_4_ * fVar197;
  auVar138._8_4_ = auVar44._8_4_ * fVar213 + auVar33._8_4_ * fVar202 * auVar43._8_4_ * fVar197;
  auVar138._12_4_ = auVar44._12_4_ * fVar214 + auVar33._12_4_ * fVar202 * auVar43._12_4_ * fVar197;
  auVar43 = vsubps_avx(auVar36,auVar138);
  local_228._0_4_ = auVar46._0_4_ + auVar152._0_4_;
  local_228._4_4_ = auVar46._4_4_ + auVar152._4_4_;
  fStack_220 = auVar46._8_4_ + auVar152._8_4_;
  fStack_21c = auVar46._12_4_ + auVar152._12_4_;
  auVar33 = vshufps_avx(auVar34,auVar34,0xff);
  auVar139._0_4_ = fVar215 * auVar33._0_4_;
  auVar139._4_4_ = fVar221 * auVar33._4_4_;
  auVar139._8_4_ = fVar222 * auVar33._8_4_;
  auVar139._12_4_ = fVar223 * auVar33._12_4_;
  local_238 = vsubps_avx(auVar34,auVar139);
  auVar44 = vshufps_avx(auVar39,auVar39,0xff);
  auVar37._0_4_ = fVar215 * auVar44._0_4_ + auVar33._0_4_ * fVar88 * auVar42._0_4_ * fVar198;
  auVar37._4_4_ = fVar221 * auVar44._4_4_ + auVar33._4_4_ * fVar88 * auVar42._4_4_ * fVar198;
  auVar37._8_4_ = fVar222 * auVar44._8_4_ + auVar33._8_4_ * fVar88 * auVar42._8_4_ * fVar198;
  auVar37._12_4_ = fVar223 * auVar44._12_4_ + auVar33._12_4_ * fVar88 * auVar42._12_4_ * fVar198;
  auVar33 = vsubps_avx(auVar39,auVar37);
  _local_248 = vaddps_avx512vl(auVar34,auVar139);
  auVar101._0_4_ = auVar43._0_4_ * 0.33333334;
  auVar101._4_4_ = auVar43._4_4_ * 0.33333334;
  auVar101._8_4_ = auVar43._8_4_ * 0.33333334;
  auVar101._12_4_ = auVar43._12_4_ * 0.33333334;
  local_258 = vaddps_avx512vl(local_218,auVar101);
  auVar102._0_4_ = auVar33._0_4_ * 0.33333334;
  auVar102._4_4_ = auVar33._4_4_ * 0.33333334;
  auVar102._8_4_ = auVar33._8_4_ * 0.33333334;
  auVar102._12_4_ = auVar33._12_4_ * 0.33333334;
  local_268 = vsubps_avx512vl(local_238,auVar102);
  auVar46._0_4_ = (fVar199 + auVar138._0_4_) * 0.33333334;
  auVar46._4_4_ = (fVar200 + auVar138._4_4_) * 0.33333334;
  auVar46._8_4_ = (fVar201 + auVar138._8_4_) * 0.33333334;
  auVar46._12_4_ = (fVar91 + auVar138._12_4_) * 0.33333334;
  _local_278 = vaddps_avx512vl(_local_228,auVar46);
  auVar34._0_4_ = (fVar113 + auVar37._0_4_) * 0.33333334;
  auVar34._4_4_ = (fVar123 + auVar37._4_4_) * 0.33333334;
  auVar34._8_4_ = (fVar124 + auVar37._8_4_) * 0.33333334;
  auVar34._12_4_ = (fVar125 + auVar37._12_4_) * 0.33333334;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  _local_288 = vsubps_avx512vl(_local_248,auVar34);
  auVar44 = vsubps_avx(local_218,(undefined1  [16])aVar1);
  uVar89 = auVar44._0_4_;
  auVar47._4_4_ = uVar89;
  auVar47._0_4_ = uVar89;
  auVar47._8_4_ = uVar89;
  auVar47._12_4_ = uVar89;
  auVar33 = vshufps_avx(auVar44,auVar44,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar202 = (pre->ray_space).vz.field_0.m128[0];
  fVar88 = (pre->ray_space).vz.field_0.m128[1];
  fVar197 = (pre->ray_space).vz.field_0.m128[2];
  fVar198 = (pre->ray_space).vz.field_0.m128[3];
  auVar36._0_4_ = fVar202 * auVar44._0_4_;
  auVar36._4_4_ = fVar88 * auVar44._4_4_;
  auVar36._8_4_ = fVar197 * auVar44._8_4_;
  auVar36._12_4_ = fVar198 * auVar44._12_4_;
  auVar33 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar3,auVar33);
  auVar41 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar47);
  auVar44 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar89 = auVar44._0_4_;
  auVar103._4_4_ = uVar89;
  auVar103._0_4_ = uVar89;
  auVar103._8_4_ = uVar89;
  auVar103._12_4_ = uVar89;
  auVar33 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar45._0_4_ = fVar202 * auVar44._0_4_;
  auVar45._4_4_ = fVar88 * auVar44._4_4_;
  auVar45._8_4_ = fVar197 * auVar44._8_4_;
  auVar45._12_4_ = fVar198 * auVar44._12_4_;
  auVar33 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar33);
  auVar40 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar103);
  auVar44 = vsubps_avx512vl(local_268,(undefined1  [16])aVar1);
  uVar89 = auVar44._0_4_;
  auVar153._4_4_ = uVar89;
  auVar153._0_4_ = uVar89;
  auVar153._8_4_ = uVar89;
  auVar153._12_4_ = uVar89;
  auVar33 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar48._0_4_ = fVar202 * auVar44._0_4_;
  auVar48._4_4_ = fVar88 * auVar44._4_4_;
  auVar48._8_4_ = fVar197 * auVar44._8_4_;
  auVar48._12_4_ = fVar198 * auVar44._12_4_;
  auVar33 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar3,auVar33);
  auVar39 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar153);
  auVar44 = vsubps_avx(local_238,(undefined1  [16])aVar1);
  uVar89 = auVar44._0_4_;
  auVar169._4_4_ = uVar89;
  auVar169._0_4_ = uVar89;
  auVar169._8_4_ = uVar89;
  auVar169._12_4_ = uVar89;
  auVar33 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar154._0_4_ = fVar202 * auVar44._0_4_;
  auVar154._4_4_ = fVar88 * auVar44._4_4_;
  auVar154._8_4_ = fVar197 * auVar44._8_4_;
  auVar154._12_4_ = fVar198 * auVar44._12_4_;
  auVar33 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar3,auVar33);
  auVar38 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar169);
  auVar44 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
  uVar89 = auVar44._0_4_;
  auVar180._4_4_ = uVar89;
  auVar180._0_4_ = uVar89;
  auVar180._8_4_ = uVar89;
  auVar180._12_4_ = uVar89;
  auVar33 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar170._0_4_ = auVar44._0_4_ * fVar202;
  auVar170._4_4_ = auVar44._4_4_ * fVar88;
  auVar170._8_4_ = auVar44._8_4_ * fVar197;
  auVar170._12_4_ = auVar44._12_4_ * fVar198;
  auVar33 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar3,auVar33);
  auVar35 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar180);
  auVar44 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar89 = auVar44._0_4_;
  auVar187._4_4_ = uVar89;
  auVar187._0_4_ = uVar89;
  auVar187._8_4_ = uVar89;
  auVar187._12_4_ = uVar89;
  auVar33 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar181._0_4_ = auVar44._0_4_ * fVar202;
  auVar181._4_4_ = auVar44._4_4_ * fVar88;
  auVar181._8_4_ = auVar44._8_4_ * fVar197;
  auVar181._12_4_ = auVar44._12_4_ * fVar198;
  auVar33 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar33);
  auVar46 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar187);
  auVar44 = vsubps_avx512vl(_local_288,(undefined1  [16])aVar1);
  uVar89 = auVar44._0_4_;
  auVar204._4_4_ = uVar89;
  auVar204._0_4_ = uVar89;
  auVar204._8_4_ = uVar89;
  auVar204._12_4_ = uVar89;
  auVar33 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar188._0_4_ = auVar44._0_4_ * fVar202;
  auVar188._4_4_ = auVar44._4_4_ * fVar88;
  auVar188._8_4_ = auVar44._8_4_ * fVar197;
  auVar188._12_4_ = auVar44._12_4_ * fVar198;
  auVar33 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar3,auVar33);
  auVar34 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar204);
  auVar44 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar1);
  uVar89 = auVar44._0_4_;
  auVar205._4_4_ = uVar89;
  auVar205._0_4_ = uVar89;
  auVar205._8_4_ = uVar89;
  auVar205._12_4_ = uVar89;
  auVar33 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar128._0_4_ = fVar202 * auVar44._0_4_;
  auVar128._4_4_ = fVar88 * auVar44._4_4_;
  auVar128._8_4_ = fVar197 * auVar44._8_4_;
  auVar128._12_4_ = fVar198 * auVar44._12_4_;
  auVar33 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar3,auVar33);
  auVar36 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar205);
  local_338 = vmovlhps_avx512f(auVar41,auVar35);
  auVar246 = ZEXT1664(local_338);
  local_2d8 = vmovlhps_avx(auVar40,auVar46);
  local_2e8 = vmovlhps_avx512f(auVar39,auVar34);
  _local_1f8 = vmovlhps_avx512f(auVar38,auVar36);
  auVar33 = vminps_avx512vl(local_338,local_2d8);
  auVar43 = vmaxps_avx512vl(local_338,local_2d8);
  auVar44 = vminps_avx512vl(local_2e8,_local_1f8);
  auVar44 = vminps_avx(auVar33,auVar44);
  auVar33 = vmaxps_avx512vl(local_2e8,_local_1f8);
  auVar33 = vmaxps_avx(auVar43,auVar33);
  auVar43 = vshufpd_avx(auVar44,auVar44,3);
  auVar42 = vshufpd_avx(auVar33,auVar33,3);
  auVar44 = vminps_avx(auVar44,auVar43);
  auVar33 = vmaxps_avx(auVar33,auVar42);
  auVar44 = vandps_avx512vl(auVar44,auVar239._0_16_);
  auVar33 = vandps_avx512vl(auVar33,auVar239._0_16_);
  auVar33 = vmaxps_avx(auVar44,auVar33);
  auVar44 = vmovshdup_avx(auVar33);
  auVar33 = vmaxss_avx(auVar44,auVar33);
  local_178._8_8_ = auVar41._0_8_;
  local_178._0_8_ = auVar41._0_8_;
  local_188._8_8_ = auVar40._0_8_;
  local_188._0_8_ = auVar40._0_8_;
  local_198 = vmovddup_avx512vl(auVar39);
  local_1a8._0_8_ = auVar38._0_8_;
  local_1a8._8_8_ = local_1a8._0_8_;
  register0x00001348 = auVar35._0_8_;
  local_1b8 = auVar35._0_8_;
  register0x00001408 = auVar46._0_8_;
  local_1c8 = auVar46._0_8_;
  register0x00001448 = auVar34._0_8_;
  local_1d8 = auVar34._0_8_;
  register0x00001488 = auVar36._0_8_;
  local_1e8 = auVar36._0_8_;
  local_208 = ZEXT416((uint)(auVar33._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_208);
  auVar33 = vxorps_avx512vl(local_78._0_16_,auVar240._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar33);
  local_308 = vsubps_avx512vl(local_2d8,local_338);
  local_318 = vsubps_avx512vl(local_2e8,local_2d8);
  local_e8 = vsubps_avx512vl(_local_1f8,local_2e8);
  local_f8 = vsubps_avx(_local_228,local_218);
  local_108 = vsubps_avx512vl(_local_278,local_258);
  local_118 = vsubps_avx512vl(_local_288,local_268);
  _local_128 = vsubps_avx512vl(_local_248,local_238);
  uVar25 = 0;
  auVar33 = ZEXT816(0x3f80000000000000);
  auVar236 = ZEXT1664(auVar33);
  do {
    auVar35 = auVar236._0_16_;
    auVar247 = ZEXT1664(auVar35);
    auVar44 = vshufps_avx(auVar35,auVar35,0x50);
    auVar225._8_4_ = 0x3f800000;
    auVar225._0_8_ = &DAT_3f8000003f800000;
    auVar225._12_4_ = 0x3f800000;
    auVar228._16_4_ = 0x3f800000;
    auVar228._0_16_ = auVar225;
    auVar228._20_4_ = 0x3f800000;
    auVar228._24_4_ = 0x3f800000;
    auVar228._28_4_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar225,auVar44);
    fVar202 = auVar44._0_4_;
    auVar114._0_4_ = local_1b8._0_4_ * fVar202;
    fVar88 = auVar44._4_4_;
    auVar114._4_4_ = local_1b8._4_4_ * fVar88;
    fVar197 = auVar44._8_4_;
    auVar114._8_4_ = local_1b8._8_4_ * fVar197;
    fVar198 = auVar44._12_4_;
    auVar114._12_4_ = local_1b8._12_4_ * fVar198;
    auVar129._0_4_ = local_1c8._0_4_ * fVar202;
    auVar129._4_4_ = local_1c8._4_4_ * fVar88;
    auVar129._8_4_ = local_1c8._8_4_ * fVar197;
    auVar129._12_4_ = local_1c8._12_4_ * fVar198;
    auVar140._0_4_ = local_1d8._0_4_ * fVar202;
    auVar140._4_4_ = local_1d8._4_4_ * fVar88;
    auVar140._8_4_ = local_1d8._8_4_ * fVar197;
    auVar140._12_4_ = local_1d8._12_4_ * fVar198;
    auVar92._0_4_ = local_1e8._0_4_ * fVar202;
    auVar92._4_4_ = local_1e8._4_4_ * fVar88;
    auVar92._8_4_ = local_1e8._8_4_ * fVar197;
    auVar92._12_4_ = local_1e8._12_4_ * fVar198;
    auVar42 = vfmadd231ps_fma(auVar114,auVar43,local_178);
    auVar41 = vfmadd231ps_fma(auVar129,auVar43,local_188);
    auVar40 = vfmadd231ps_avx512vl(auVar140,auVar43,local_198);
    auVar43 = vfmadd231ps_fma(auVar92,local_1a8,auVar43);
    auVar44 = vmovshdup_avx(auVar33);
    fVar88 = auVar33._0_4_;
    fVar202 = (auVar44._0_4_ - fVar88) * 0.04761905;
    auVar166._4_4_ = fVar88;
    auVar166._0_4_ = fVar88;
    auVar166._8_4_ = fVar88;
    auVar166._12_4_ = fVar88;
    auVar166._16_4_ = fVar88;
    auVar166._20_4_ = fVar88;
    auVar166._24_4_ = fVar88;
    auVar166._28_4_ = fVar88;
    auVar110._0_8_ = auVar44._0_8_;
    auVar110._8_8_ = auVar110._0_8_;
    auVar110._16_8_ = auVar110._0_8_;
    auVar110._24_8_ = auVar110._0_8_;
    auVar57 = vsubps_avx(auVar110,auVar166);
    uVar89 = auVar42._0_4_;
    auVar111._4_4_ = uVar89;
    auVar111._0_4_ = uVar89;
    auVar111._8_4_ = uVar89;
    auVar111._12_4_ = uVar89;
    auVar111._16_4_ = uVar89;
    auVar111._20_4_ = uVar89;
    auVar111._24_4_ = uVar89;
    auVar111._28_4_ = uVar89;
    auVar69 = ZEXT1632(auVar42);
    auVar53 = auVar243._0_32_;
    auVar55 = vpermps_avx512vl(auVar53,auVar69);
    auVar62 = vbroadcastss_avx512vl(auVar41);
    auVar70 = ZEXT1632(auVar41);
    auVar56 = vpermps_avx512vl(auVar53,auVar70);
    auVar63 = vbroadcastss_avx512vl(auVar40);
    auVar51 = ZEXT1632(auVar40);
    auVar64 = vpermps_avx512vl(auVar53,auVar51);
    auVar65 = vbroadcastss_avx512vl(auVar43);
    auVar52 = ZEXT1632(auVar43);
    auVar53 = vpermps_avx512vl(auVar53,auVar52);
    auVar185._4_4_ = fVar202;
    auVar185._0_4_ = fVar202;
    auVar185._8_4_ = fVar202;
    auVar185._12_4_ = fVar202;
    auVar185._16_4_ = fVar202;
    auVar185._20_4_ = fVar202;
    auVar185._24_4_ = fVar202;
    auVar185._28_4_ = fVar202;
    auVar67 = auVar244._0_32_;
    auVar54 = vpermps_avx512vl(auVar67,auVar69);
    auVar150._8_4_ = 3;
    auVar150._0_8_ = 0x300000003;
    auVar150._12_4_ = 3;
    auVar150._16_4_ = 3;
    auVar150._20_4_ = 3;
    auVar150._24_4_ = 3;
    auVar150._28_4_ = 3;
    auVar66 = vpermps_avx512vl(auVar150,auVar69);
    auVar49 = vpermps_avx512vl(auVar67,auVar70);
    auVar69 = vpermps_avx2(auVar150,auVar70);
    auVar50 = vpermps_avx512vl(auVar67,auVar51);
    auVar70 = vpermps_avx2(auVar150,auVar51);
    auVar51 = vpermps_avx512vl(auVar67,auVar52);
    auVar52 = vpermps_avx512vl(auVar150,auVar52);
    auVar44 = vfmadd132ps_fma(auVar57,auVar166,_DAT_02020f20);
    auVar57 = vsubps_avx(auVar228,ZEXT1632(auVar44));
    auVar67 = vmulps_avx512vl(auVar62,ZEXT1632(auVar44));
    auVar71 = ZEXT1632(auVar44);
    auVar68 = vmulps_avx512vl(auVar56,auVar71);
    auVar43 = vfmadd231ps_fma(auVar67,auVar57,auVar111);
    auVar42 = vfmadd231ps_fma(auVar68,auVar57,auVar55);
    auVar67 = vmulps_avx512vl(auVar63,auVar71);
    auVar68 = vmulps_avx512vl(auVar64,auVar71);
    auVar62 = vfmadd231ps_avx512vl(auVar67,auVar57,auVar62);
    auVar56 = vfmadd231ps_avx512vl(auVar68,auVar57,auVar56);
    auVar67 = vmulps_avx512vl(auVar65,auVar71);
    auVar68 = ZEXT1632(auVar44);
    auVar53 = vmulps_avx512vl(auVar53,auVar68);
    auVar63 = vfmadd231ps_avx512vl(auVar67,auVar57,auVar63);
    auVar64 = vfmadd231ps_avx512vl(auVar53,auVar57,auVar64);
    fVar197 = auVar44._0_4_;
    fVar198 = auVar44._4_4_;
    auVar16._4_4_ = fVar198 * auVar62._4_4_;
    auVar16._0_4_ = fVar197 * auVar62._0_4_;
    fVar199 = auVar44._8_4_;
    auVar16._8_4_ = fVar199 * auVar62._8_4_;
    fVar200 = auVar44._12_4_;
    auVar16._12_4_ = fVar200 * auVar62._12_4_;
    auVar16._16_4_ = auVar62._16_4_ * 0.0;
    auVar16._20_4_ = auVar62._20_4_ * 0.0;
    auVar16._24_4_ = auVar62._24_4_ * 0.0;
    auVar16._28_4_ = fVar88;
    auVar17._4_4_ = fVar198 * auVar56._4_4_;
    auVar17._0_4_ = fVar197 * auVar56._0_4_;
    auVar17._8_4_ = fVar199 * auVar56._8_4_;
    auVar17._12_4_ = fVar200 * auVar56._12_4_;
    auVar17._16_4_ = auVar56._16_4_ * 0.0;
    auVar17._20_4_ = auVar56._20_4_ * 0.0;
    auVar17._24_4_ = auVar56._24_4_ * 0.0;
    auVar17._28_4_ = auVar55._28_4_;
    auVar43 = vfmadd231ps_fma(auVar16,auVar57,ZEXT1632(auVar43));
    auVar42 = vfmadd231ps_fma(auVar17,auVar57,ZEXT1632(auVar42));
    auVar98._0_4_ = fVar197 * auVar63._0_4_;
    auVar98._4_4_ = fVar198 * auVar63._4_4_;
    auVar98._8_4_ = fVar199 * auVar63._8_4_;
    auVar98._12_4_ = fVar200 * auVar63._12_4_;
    auVar98._16_4_ = auVar63._16_4_ * 0.0;
    auVar98._20_4_ = auVar63._20_4_ * 0.0;
    auVar98._24_4_ = auVar63._24_4_ * 0.0;
    auVar98._28_4_ = 0;
    auVar18._4_4_ = fVar198 * auVar64._4_4_;
    auVar18._0_4_ = fVar197 * auVar64._0_4_;
    auVar18._8_4_ = fVar199 * auVar64._8_4_;
    auVar18._12_4_ = fVar200 * auVar64._12_4_;
    auVar18._16_4_ = auVar64._16_4_ * 0.0;
    auVar18._20_4_ = auVar64._20_4_ * 0.0;
    auVar18._24_4_ = auVar64._24_4_ * 0.0;
    auVar18._28_4_ = auVar63._28_4_;
    auVar41 = vfmadd231ps_fma(auVar98,auVar57,auVar62);
    auVar40 = vfmadd231ps_fma(auVar18,auVar57,auVar56);
    auVar19._28_4_ = auVar56._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar200 * auVar40._12_4_,
                            CONCAT48(fVar199 * auVar40._8_4_,
                                     CONCAT44(fVar198 * auVar40._4_4_,fVar197 * auVar40._0_4_))));
    auVar39 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar41._12_4_,
                                                 CONCAT48(fVar199 * auVar41._8_4_,
                                                          CONCAT44(fVar198 * auVar41._4_4_,
                                                                   fVar197 * auVar41._0_4_)))),
                              auVar57,ZEXT1632(auVar43));
    auVar38 = vfmadd231ps_fma(auVar19,auVar57,ZEXT1632(auVar42));
    auVar55 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar43));
    auVar62 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar42));
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar55 = vmulps_avx512vl(auVar55,auVar56);
    auVar62 = vmulps_avx512vl(auVar62,auVar56);
    auVar178._0_4_ = fVar202 * auVar55._0_4_;
    auVar178._4_4_ = fVar202 * auVar55._4_4_;
    auVar178._8_4_ = fVar202 * auVar55._8_4_;
    auVar178._12_4_ = fVar202 * auVar55._12_4_;
    auVar178._16_4_ = fVar202 * auVar55._16_4_;
    auVar178._20_4_ = fVar202 * auVar55._20_4_;
    auVar178._24_4_ = fVar202 * auVar55._24_4_;
    auVar178._28_4_ = 0;
    auVar55 = vmulps_avx512vl(auVar185,auVar62);
    auVar41 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
    auVar62 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_0205fd20,ZEXT1632(auVar41));
    auVar63 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_0205fd20,ZEXT1632(auVar41));
    auVar99._0_4_ = auVar178._0_4_ + auVar39._0_4_;
    auVar99._4_4_ = auVar178._4_4_ + auVar39._4_4_;
    auVar99._8_4_ = auVar178._8_4_ + auVar39._8_4_;
    auVar99._12_4_ = auVar178._12_4_ + auVar39._12_4_;
    auVar99._16_4_ = auVar178._16_4_ + 0.0;
    auVar99._20_4_ = auVar178._20_4_ + 0.0;
    auVar99._24_4_ = auVar178._24_4_ + 0.0;
    auVar99._28_4_ = 0;
    auVar71 = ZEXT1632(auVar41);
    auVar64 = vpermt2ps_avx512vl(auVar178,_DAT_0205fd20,auVar71);
    auVar65 = vaddps_avx512vl(ZEXT1632(auVar38),auVar55);
    auVar53 = vpermt2ps_avx512vl(auVar55,_DAT_0205fd20,auVar71);
    auVar55 = vsubps_avx(auVar62,auVar64);
    auVar64 = vsubps_avx512vl(auVar63,auVar53);
    auVar53 = vmulps_avx512vl(auVar49,auVar68);
    auVar67 = vmulps_avx512vl(auVar69,auVar68);
    auVar53 = vfmadd231ps_avx512vl(auVar53,auVar57,auVar54);
    auVar54 = vfmadd231ps_avx512vl(auVar67,auVar57,auVar66);
    auVar66 = vmulps_avx512vl(auVar50,auVar68);
    auVar67 = vmulps_avx512vl(auVar70,auVar68);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar57,auVar49);
    auVar69 = vfmadd231ps_avx512vl(auVar67,auVar57,auVar69);
    auVar49 = vmulps_avx512vl(auVar51,auVar68);
    auVar51 = vmulps_avx512vl(auVar52,auVar68);
    auVar43 = vfmadd231ps_fma(auVar49,auVar57,auVar50);
    auVar42 = vfmadd231ps_fma(auVar51,auVar57,auVar70);
    auVar49 = vmulps_avx512vl(auVar68,auVar66);
    auVar51 = vmulps_avx512vl(ZEXT1632(auVar44),auVar69);
    auVar53 = vfmadd231ps_avx512vl(auVar49,auVar57,auVar53);
    auVar54 = vfmadd231ps_avx512vl(auVar51,auVar57,auVar54);
    auVar66 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar200 * auVar43._12_4_,
                                            CONCAT48(fVar199 * auVar43._8_4_,
                                                     CONCAT44(fVar198 * auVar43._4_4_,
                                                              fVar197 * auVar43._0_4_)))),auVar57,
                         auVar66);
    auVar69 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar200 * auVar42._12_4_,
                                            CONCAT48(fVar199 * auVar42._8_4_,
                                                     CONCAT44(fVar198 * auVar42._4_4_,
                                                              fVar197 * auVar42._0_4_)))),auVar57,
                         auVar69);
    auVar20._4_4_ = fVar198 * auVar66._4_4_;
    auVar20._0_4_ = fVar197 * auVar66._0_4_;
    auVar20._8_4_ = fVar199 * auVar66._8_4_;
    auVar20._12_4_ = fVar200 * auVar66._12_4_;
    auVar20._16_4_ = auVar66._16_4_ * 0.0;
    auVar20._20_4_ = auVar66._20_4_ * 0.0;
    auVar20._24_4_ = auVar66._24_4_ * 0.0;
    auVar20._28_4_ = auVar70._28_4_;
    auVar21._4_4_ = fVar198 * auVar69._4_4_;
    auVar21._0_4_ = fVar197 * auVar69._0_4_;
    auVar21._8_4_ = fVar199 * auVar69._8_4_;
    auVar21._12_4_ = fVar200 * auVar69._12_4_;
    auVar21._16_4_ = auVar69._16_4_ * 0.0;
    auVar21._20_4_ = auVar69._20_4_ * 0.0;
    auVar21._24_4_ = auVar69._24_4_ * 0.0;
    auVar21._28_4_ = auVar50._28_4_;
    auVar70 = vfmadd231ps_avx512vl(auVar20,auVar57,auVar53);
    auVar49 = vfmadd231ps_avx512vl(auVar21,auVar54,auVar57);
    auVar57 = vsubps_avx512vl(auVar66,auVar53);
    auVar69 = vsubps_avx512vl(auVar69,auVar54);
    auVar57 = vmulps_avx512vl(auVar57,auVar56);
    auVar69 = vmulps_avx512vl(auVar69,auVar56);
    fVar88 = fVar202 * auVar57._0_4_;
    fVar197 = fVar202 * auVar57._4_4_;
    auVar22._4_4_ = fVar197;
    auVar22._0_4_ = fVar88;
    fVar198 = fVar202 * auVar57._8_4_;
    auVar22._8_4_ = fVar198;
    fVar199 = fVar202 * auVar57._12_4_;
    auVar22._12_4_ = fVar199;
    fVar200 = fVar202 * auVar57._16_4_;
    auVar22._16_4_ = fVar200;
    fVar201 = fVar202 * auVar57._20_4_;
    auVar22._20_4_ = fVar201;
    fVar202 = fVar202 * auVar57._24_4_;
    auVar22._24_4_ = fVar202;
    auVar22._28_4_ = auVar57._28_4_;
    auVar69 = vmulps_avx512vl(auVar185,auVar69);
    auVar56 = vpermt2ps_avx512vl(auVar70,_DAT_0205fd20,auVar71);
    auVar53 = vpermt2ps_avx512vl(auVar49,_DAT_0205fd20,auVar71);
    auVar186._0_4_ = auVar70._0_4_ + fVar88;
    auVar186._4_4_ = auVar70._4_4_ + fVar197;
    auVar186._8_4_ = auVar70._8_4_ + fVar198;
    auVar186._12_4_ = auVar70._12_4_ + fVar199;
    auVar186._16_4_ = auVar70._16_4_ + fVar200;
    auVar186._20_4_ = auVar70._20_4_ + fVar201;
    auVar186._24_4_ = auVar70._24_4_ + fVar202;
    auVar186._28_4_ = auVar70._28_4_ + auVar57._28_4_;
    auVar57 = vpermt2ps_avx512vl(auVar22,_DAT_0205fd20,ZEXT1632(auVar41));
    auVar54 = vaddps_avx512vl(auVar49,auVar69);
    auVar69 = vpermt2ps_avx512vl(auVar69,_DAT_0205fd20,ZEXT1632(auVar41));
    auVar57 = vsubps_avx(auVar56,auVar57);
    auVar69 = vsubps_avx512vl(auVar53,auVar69);
    auVar120 = ZEXT1632(auVar39);
    auVar66 = vsubps_avx512vl(auVar70,auVar120);
    auVar133 = ZEXT1632(auVar38);
    auVar50 = vsubps_avx512vl(auVar49,auVar133);
    auVar51 = vsubps_avx512vl(auVar56,auVar62);
    auVar66 = vaddps_avx512vl(auVar66,auVar51);
    auVar51 = vsubps_avx512vl(auVar53,auVar63);
    auVar50 = vaddps_avx512vl(auVar50,auVar51);
    auVar51 = vmulps_avx512vl(auVar133,auVar66);
    auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar120,auVar50);
    auVar52 = vmulps_avx512vl(auVar65,auVar66);
    auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar99,auVar50);
    auVar67 = vmulps_avx512vl(auVar64,auVar66);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar55,auVar50);
    auVar68 = vmulps_avx512vl(auVar63,auVar66);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar62,auVar50);
    auVar71 = vmulps_avx512vl(auVar49,auVar66);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar70,auVar50);
    auVar72 = vmulps_avx512vl(auVar54,auVar66);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar186,auVar50);
    auVar73 = vmulps_avx512vl(auVar69,auVar66);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar57,auVar50);
    auVar66 = vmulps_avx512vl(auVar53,auVar66);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar56,auVar50);
    auVar50 = vminps_avx512vl(auVar51,auVar52);
    auVar51 = vmaxps_avx512vl(auVar51,auVar52);
    auVar52 = vminps_avx512vl(auVar67,auVar68);
    auVar50 = vminps_avx512vl(auVar50,auVar52);
    auVar52 = vmaxps_avx512vl(auVar67,auVar68);
    auVar51 = vmaxps_avx512vl(auVar51,auVar52);
    auVar52 = vminps_avx512vl(auVar71,auVar72);
    auVar67 = vmaxps_avx512vl(auVar71,auVar72);
    auVar68 = vminps_avx512vl(auVar73,auVar66);
    auVar52 = vminps_avx512vl(auVar52,auVar68);
    auVar50 = vminps_avx512vl(auVar50,auVar52);
    auVar66 = vmaxps_avx512vl(auVar73,auVar66);
    auVar66 = vmaxps_avx512vl(auVar67,auVar66);
    auVar66 = vmaxps_avx512vl(auVar51,auVar66);
    uVar12 = vcmpps_avx512vl(auVar50,local_78,2);
    uVar13 = vcmpps_avx512vl(auVar66,local_98,5);
    uVar27 = 0;
    bVar23 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar23 != 0) {
      auVar66 = vsubps_avx512vl(auVar62,auVar120);
      auVar50 = vsubps_avx512vl(auVar63,auVar133);
      auVar51 = vsubps_avx512vl(auVar56,auVar70);
      auVar66 = vaddps_avx512vl(auVar66,auVar51);
      auVar51 = vsubps_avx512vl(auVar53,auVar49);
      auVar50 = vaddps_avx512vl(auVar50,auVar51);
      auVar51 = vmulps_avx512vl(auVar133,auVar66);
      auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar50,auVar120);
      auVar65 = vmulps_avx512vl(auVar65,auVar66);
      auVar65 = vfnmadd213ps_avx512vl(auVar99,auVar50,auVar65);
      auVar64 = vmulps_avx512vl(auVar64,auVar66);
      auVar64 = vfnmadd213ps_avx512vl(auVar55,auVar50,auVar64);
      auVar55 = vmulps_avx512vl(auVar63,auVar66);
      auVar63 = vfnmadd231ps_avx512vl(auVar55,auVar50,auVar62);
      auVar55 = vmulps_avx512vl(auVar49,auVar66);
      auVar49 = vfnmadd231ps_avx512vl(auVar55,auVar50,auVar70);
      auVar55 = vmulps_avx512vl(auVar54,auVar66);
      auVar54 = vfnmadd213ps_avx512vl(auVar186,auVar50,auVar55);
      auVar55 = vmulps_avx512vl(auVar69,auVar66);
      auVar52 = vfnmadd213ps_avx512vl(auVar57,auVar50,auVar55);
      auVar57 = vmulps_avx512vl(auVar53,auVar66);
      auVar53 = vfnmadd231ps_avx512vl(auVar57,auVar56,auVar50);
      auVar55 = vminps_avx(auVar51,auVar65);
      auVar57 = vmaxps_avx(auVar51,auVar65);
      auVar62 = vminps_avx(auVar64,auVar63);
      auVar62 = vminps_avx(auVar55,auVar62);
      auVar55 = vmaxps_avx(auVar64,auVar63);
      auVar57 = vmaxps_avx(auVar57,auVar55);
      auVar70 = vminps_avx(auVar49,auVar54);
      auVar55 = vmaxps_avx(auVar49,auVar54);
      auVar56 = vminps_avx(auVar52,auVar53);
      auVar70 = vminps_avx(auVar70,auVar56);
      auVar70 = vminps_avx(auVar62,auVar70);
      auVar62 = vmaxps_avx(auVar52,auVar53);
      auVar55 = vmaxps_avx(auVar55,auVar62);
      auVar57 = vmaxps_avx(auVar57,auVar55);
      uVar12 = vcmpps_avx512vl(auVar57,local_98,5);
      uVar13 = vcmpps_avx512vl(auVar70,local_78,2);
      uVar27 = (uint)(bVar23 & (byte)uVar12 & (byte)uVar13);
    }
    if (uVar27 != 0) {
      auStack_168[uVar25] = uVar27;
      uVar12 = vmovlps_avx(auVar33);
      *(undefined8 *)(&uStack_d8 + uVar25 * 2) = uVar12;
      uVar32 = vmovlps_avx512f(auVar35);
      auStack_58[uVar25] = uVar32;
      uVar25 = (ulong)((int)uVar25 + 1);
    }
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar238 = ZEXT1664(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar239 = ZEXT1664(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar240 = ZEXT1664(auVar33);
    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM20 = ZEXT3264(auVar57);
    auVar241 = ZEXT464(0x3f800000);
    auVar86._16_16_ = auVar57._16_16_;
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar242 = ZEXT1664(auVar33);
    auVar33 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
    auVar237 = ZEXT1664(auVar33);
    auVar245 = ZEXT1664(local_308);
    auVar86._0_16_ = local_318;
    auVar248 = ZEXT1664(local_318);
    do {
      auVar33 = auVar242._0_16_;
      if ((int)uVar25 == 0) {
        fVar202 = (ray->super_RayK<1>).tfar;
        auVar15._4_4_ = fVar202;
        auVar15._0_4_ = fVar202;
        auVar15._8_4_ = fVar202;
        auVar15._12_4_ = fVar202;
        auVar15._16_4_ = fVar202;
        auVar15._20_4_ = fVar202;
        auVar15._24_4_ = fVar202;
        auVar15._28_4_ = fVar202;
        uVar12 = vcmpps_avx512vl(local_b8,auVar15,2);
        uVar30 = (uint)uVar31 & (uint)uVar12;
        uVar31 = (ulong)uVar30;
        if (uVar30 == 0) {
          return;
        }
        goto LAB_01d5e2a1;
      }
      uVar24 = (int)uVar25 - 1;
      uVar26 = (ulong)uVar24;
      uVar27 = (&uStack_d8)[uVar26 * 2];
      fVar202 = afStack_d4[uVar26 * 2];
      uVar5 = auStack_168[uVar26];
      auVar235._8_8_ = 0;
      auVar235._0_8_ = auStack_58[uVar26];
      auVar236 = ZEXT1664(auVar235);
      lVar29 = 0;
      for (uVar32 = (ulong)uVar5; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar28 = uVar5 - 1 & uVar5;
      auStack_168[uVar26] = uVar28;
      if (uVar28 == 0) {
        uVar25 = (ulong)uVar24;
      }
      auVar43 = vpxord_avx512vl(auVar247._0_16_,auVar247._0_16_);
      auVar44 = vcvtsi2ss_avx512f(auVar43,lVar29);
      auVar42 = vmulss_avx512f(auVar44,SUB6416(ZEXT464(0x3e124925),0));
      lVar29 = lVar29 + 1;
      auVar44 = vpxord_avx512vl(auVar43,auVar43);
      auVar44 = vcvtsi2ss_avx512f(auVar44,lVar29);
      auVar44 = vmulss_avx512f(auVar44,SUB6416(ZEXT464(0x3e124925),0));
      auVar41 = auVar241._0_16_;
      auVar43 = vsubss_avx512f(auVar41,auVar42);
      local_2f8 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar42._0_4_)),ZEXT416(uVar27),auVar43);
      auVar43 = vsubss_avx512f(auVar41,auVar44);
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar44._0_4_)),ZEXT416(uVar27),auVar43);
      fVar88 = auVar44._0_4_;
      fVar197 = local_2f8._0_4_;
      fVar202 = fVar88 - fVar197;
      vucomiss_avx512f(ZEXT416((uint)fVar202));
      if (uVar5 == 0 || lVar29 == 0) break;
      auVar247 = ZEXT1664(auVar235);
      auVar43 = vshufps_avx(auVar235,auVar235,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar202));
      auVar39 = vsubps_avx512vl(auVar33,auVar43);
      fVar198 = auVar43._0_4_;
      auVar115._0_4_ = fVar198 * (float)local_1b8._0_4_;
      fVar199 = auVar43._4_4_;
      auVar115._4_4_ = fVar199 * (float)local_1b8._4_4_;
      fVar200 = auVar43._8_4_;
      auVar115._8_4_ = fVar200 * fStack_1b0;
      fVar201 = auVar43._12_4_;
      auVar115._12_4_ = fVar201 * fStack_1ac;
      auVar130._0_4_ = fVar198 * (float)local_1c8._0_4_;
      auVar130._4_4_ = fVar199 * (float)local_1c8._4_4_;
      auVar130._8_4_ = fVar200 * fStack_1c0;
      auVar130._12_4_ = fVar201 * fStack_1bc;
      auVar141._0_4_ = fVar198 * (float)local_1d8._0_4_;
      auVar141._4_4_ = fVar199 * (float)local_1d8._4_4_;
      auVar141._8_4_ = fVar200 * fStack_1d0;
      auVar141._12_4_ = fVar201 * fStack_1cc;
      auVar93._0_4_ = fVar198 * (float)local_1e8._0_4_;
      auVar93._4_4_ = fVar199 * (float)local_1e8._4_4_;
      auVar93._8_4_ = fVar200 * fStack_1e0;
      auVar93._12_4_ = fVar201 * fStack_1dc;
      auVar43 = vfmadd231ps_fma(auVar115,auVar39,local_178);
      auVar42 = vfmadd231ps_fma(auVar130,auVar39,local_188);
      auVar40 = vfmadd231ps_fma(auVar141,auVar39,local_198);
      auVar39 = vfmadd231ps_fma(auVar93,auVar39,local_1a8);
      auVar112._16_16_ = auVar43;
      auVar112._0_16_ = auVar43;
      auVar121._16_16_ = auVar42;
      auVar121._0_16_ = auVar42;
      auVar134._16_16_ = auVar40;
      auVar134._0_16_ = auVar40;
      auVar151._4_4_ = fVar197;
      auVar151._0_4_ = fVar197;
      auVar151._8_4_ = fVar197;
      auVar151._12_4_ = fVar197;
      auVar151._20_4_ = fVar88;
      auVar151._16_4_ = fVar88;
      auVar151._24_4_ = fVar88;
      auVar151._28_4_ = fVar88;
      auVar57 = vsubps_avx(auVar121,auVar112);
      auVar42 = vfmadd213ps_fma(auVar57,auVar151,auVar112);
      auVar57 = vsubps_avx(auVar134,auVar121);
      auVar38 = vfmadd213ps_fma(auVar57,auVar151,auVar121);
      auVar43 = vsubps_avx(auVar39,auVar40);
      auVar122._16_16_ = auVar43;
      auVar122._0_16_ = auVar43;
      auVar43 = vfmadd213ps_fma(auVar122,auVar151,auVar134);
      auVar57 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar42));
      auVar42 = vfmadd213ps_fma(auVar57,auVar151,ZEXT1632(auVar42));
      auVar57 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar38));
      auVar43 = vfmadd213ps_fma(auVar57,auVar151,ZEXT1632(auVar38));
      auVar57 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar42));
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar57,auVar151);
      auVar57 = vmulps_avx512vl(auVar57,in_ZMM20._0_32_);
      auVar102 = auVar57._16_16_;
      fVar88 = fVar202 * 0.33333334;
      auVar142._0_8_ =
           CONCAT44(auVar101._4_4_ + fVar88 * auVar57._4_4_,auVar101._0_4_ + fVar88 * auVar57._0_4_)
      ;
      auVar142._8_4_ = auVar101._8_4_ + fVar88 * auVar57._8_4_;
      auVar142._12_4_ = auVar101._12_4_ + fVar88 * auVar57._12_4_;
      auVar116._0_4_ = fVar88 * auVar57._16_4_;
      auVar116._4_4_ = fVar88 * auVar57._20_4_;
      auVar116._8_4_ = fVar88 * auVar57._24_4_;
      auVar116._12_4_ = fVar88 * auVar57._28_4_;
      auVar45 = vsubps_avx((undefined1  [16])0x0,auVar116);
      auVar46 = vshufpd_avx(auVar101,auVar101,3);
      auVar34 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar43 = vsubps_avx(auVar46,auVar101);
      auVar42 = vsubps_avx(auVar34,(undefined1  [16])0x0);
      auVar155._0_4_ = auVar42._0_4_ + auVar43._0_4_;
      auVar155._4_4_ = auVar42._4_4_ + auVar43._4_4_;
      auVar155._8_4_ = auVar42._8_4_ + auVar43._8_4_;
      auVar155._12_4_ = auVar42._12_4_ + auVar43._12_4_;
      auVar43 = vshufps_avx(auVar101,auVar101,0xb1);
      auVar42 = vshufps_avx(auVar142,auVar142,0xb1);
      auVar40 = vshufps_avx(auVar45,auVar45,0xb1);
      auVar39 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar216._4_4_ = auVar155._0_4_;
      auVar216._0_4_ = auVar155._0_4_;
      auVar216._8_4_ = auVar155._0_4_;
      auVar216._12_4_ = auVar155._0_4_;
      auVar38 = vshufps_avx(auVar155,auVar155,0x55);
      fVar88 = auVar38._0_4_;
      auVar171._0_4_ = auVar43._0_4_ * fVar88;
      fVar197 = auVar38._4_4_;
      auVar171._4_4_ = auVar43._4_4_ * fVar197;
      fVar198 = auVar38._8_4_;
      auVar171._8_4_ = auVar43._8_4_ * fVar198;
      fVar199 = auVar38._12_4_;
      auVar171._12_4_ = auVar43._12_4_ * fVar199;
      auVar182._0_4_ = auVar42._0_4_ * fVar88;
      auVar182._4_4_ = auVar42._4_4_ * fVar197;
      auVar182._8_4_ = auVar42._8_4_ * fVar198;
      auVar182._12_4_ = auVar42._12_4_ * fVar199;
      auVar189._0_4_ = auVar40._0_4_ * fVar88;
      auVar189._4_4_ = auVar40._4_4_ * fVar197;
      auVar189._8_4_ = auVar40._8_4_ * fVar198;
      auVar189._12_4_ = auVar40._12_4_ * fVar199;
      auVar156._0_4_ = auVar39._0_4_ * fVar88;
      auVar156._4_4_ = auVar39._4_4_ * fVar197;
      auVar156._8_4_ = auVar39._8_4_ * fVar198;
      auVar156._12_4_ = auVar39._12_4_ * fVar199;
      auVar43 = vfmadd231ps_fma(auVar171,auVar216,auVar101);
      auVar42 = vfmadd231ps_fma(auVar182,auVar216,auVar142);
      auVar38 = vfmadd231ps_fma(auVar189,auVar216,auVar45);
      auVar100 = vfmadd231ps_fma(auVar156,(undefined1  [16])0x0,auVar216);
      auVar35 = vshufpd_avx(auVar43,auVar43,1);
      auVar36 = vshufpd_avx(auVar42,auVar42,1);
      auVar37 = vshufpd_avx(auVar38,auVar38,1);
      auVar47 = vshufpd_avx(auVar100,auVar100,1);
      auVar40 = vminss_avx(auVar43,auVar42);
      auVar43 = vmaxss_avx(auVar42,auVar43);
      auVar39 = vminss_avx(auVar38,auVar100);
      auVar42 = vmaxss_avx(auVar100,auVar38);
      auVar39 = vminss_avx(auVar40,auVar39);
      auVar43 = vmaxss_avx(auVar42,auVar43);
      auVar38 = vminss_avx(auVar35,auVar36);
      auVar42 = vmaxss_avx(auVar36,auVar35);
      auVar35 = vminss_avx(auVar37,auVar47);
      auVar40 = vmaxss_avx(auVar47,auVar37);
      auVar38 = vminss_avx(auVar38,auVar35);
      auVar42 = vmaxss_avx(auVar40,auVar42);
      fVar198 = auVar39._0_4_;
      fVar197 = auVar42._0_4_;
      fVar88 = auVar43._0_4_;
      if ((0.0001 <= fVar198) || (fVar197 <= -0.0001)) {
        uVar12 = vcmpps_avx512vl(auVar38,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar13 = vcmpps_avx512vl(auVar39,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar88 & ((byte)uVar13 | (byte)uVar12)) != 0) goto LAB_01d5f133;
        uVar12 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar42,5);
        uVar13 = vcmpps_avx512vl(auVar38,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar13 | (ushort)uVar12) & 1) == 0) goto LAB_01d5f133;
        bVar10 = true;
        auVar86._16_16_ = auVar102;
        auVar86._0_16_ = auVar235;
        auVar236 = ZEXT1664(auVar235);
      }
      else {
LAB_01d5f133:
        uVar12 = vcmpss_avx512f(auVar39,auVar237._0_16_,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        iVar87 = auVar241._0_4_;
        fVar199 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar87);
        uVar12 = vcmpss_avx512f(auVar43,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar200 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar87);
        auVar75._16_16_ = auVar102;
        auVar75._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar74._4_28_ = auVar75._4_28_;
        auVar74._0_4_ = (uint)(fVar199 == fVar200) * 0x7f800000;
        auVar35 = auVar74._0_16_;
        auVar77._16_16_ = auVar102;
        auVar77._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar76._4_28_ = auVar77._4_28_;
        auVar76._0_4_ = (uint)(fVar199 == fVar200) * -0x800000;
        auVar40 = auVar76._0_16_;
        uVar12 = vcmpss_avx512f(auVar38,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar201 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar87);
        auVar36 = ZEXT416(0xbf800000);
        if ((fVar199 != fVar201) || (NAN(fVar199) || NAN(fVar201))) {
          fVar199 = auVar38._0_4_;
          bVar10 = fVar199 == fVar198;
          if ((!bVar10) || (NAN(fVar199) || NAN(fVar198))) {
            auVar39 = vxorps_avx512vl(auVar39,auVar240._0_16_);
            auVar230._0_4_ = auVar39._0_4_ / (fVar199 - fVar198);
            auVar230._4_12_ = auVar39._4_12_;
            auVar39 = vsubss_avx512f(auVar41,auVar230);
            auVar36 = vxorps_avx512vl(auVar36,auVar36);
            auVar38 = vfmadd213ss_avx512f(auVar39,auVar36,auVar230);
            auVar39 = auVar38;
          }
          else {
            auVar36 = vxorps_avx512vl(auVar36,auVar36);
            vucomiss_avx512f(auVar36);
            auVar79._16_16_ = auVar102;
            auVar79._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar78._4_28_ = auVar79._4_28_;
            auVar78._0_4_ = (uint)bVar10 * auVar36._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar38 = auVar78._0_16_;
            auVar39 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar35 = vminss_avx(auVar35,auVar38);
          auVar40 = vmaxss_avx(auVar39,auVar40);
        }
        else {
          auVar36 = vxorps_avx512vl(auVar36,auVar36);
        }
        auVar237 = ZEXT1664(auVar36);
        auVar236 = ZEXT1664(auVar235);
        uVar12 = vcmpss_avx512f(auVar42,auVar36,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar198 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar87);
        if ((fVar200 != fVar198) || (NAN(fVar200) || NAN(fVar198))) {
          bVar10 = fVar197 == fVar88;
          if ((!bVar10) || (NAN(fVar197) || NAN(fVar88))) {
            auVar43 = vxorps_avx512vl(auVar43,auVar240._0_16_);
            auVar190._0_4_ = auVar43._0_4_ / (fVar197 - fVar88);
            auVar190._4_12_ = auVar43._4_12_;
            auVar43 = vsubss_avx512f(auVar41,auVar190);
            auVar42 = vfmadd213ss_avx512f(auVar43,auVar36,auVar190);
            auVar43 = auVar42;
          }
          else {
            vucomiss_avx512f(auVar36);
            auVar81._16_16_ = auVar102;
            auVar81._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar80._4_28_ = auVar81._4_28_;
            auVar80._0_4_ = (uint)bVar10 * auVar36._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar42 = auVar80._0_16_;
            auVar43 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar35 = vminss_avx(auVar35,auVar42);
          auVar40 = vmaxss_avx(auVar43,auVar40);
        }
        bVar10 = fVar201 != fVar198;
        auVar43 = vminss_avx512f(auVar35,auVar41);
        auVar83._16_16_ = auVar102;
        auVar83._0_16_ = auVar35;
        auVar82._4_28_ = auVar83._4_28_;
        auVar82._0_4_ = (uint)bVar10 * auVar43._0_4_ + (uint)!bVar10 * auVar35._0_4_;
        auVar43 = vmaxss_avx512f(auVar41,auVar40);
        auVar85._16_16_ = auVar102;
        auVar85._0_16_ = auVar40;
        auVar84._4_28_ = auVar85._4_28_;
        auVar84._0_4_ = (uint)bVar10 * auVar43._0_4_ + (uint)!bVar10 * auVar40._0_4_;
        auVar43 = vmaxss_avx512f(auVar36,auVar82._0_16_);
        auVar86._0_16_ = vminss_avx512f(auVar84._0_16_,auVar41);
        auVar86._16_16_ = auVar102;
        bVar10 = true;
        if (auVar43._0_4_ <= auVar86._0_4_) {
          auVar39 = vmaxss_avx512f(auVar36,ZEXT416((uint)(auVar43._0_4_ + -0.1)));
          auVar36 = vminss_avx512f(ZEXT416((uint)(auVar86._0_4_ + 0.1)),auVar41);
          auVar94._0_8_ = auVar101._0_8_;
          auVar94._8_8_ = auVar94._0_8_;
          auVar183._8_8_ = auVar142._0_8_;
          auVar183._0_8_ = auVar142._0_8_;
          auVar191._8_8_ = auVar45._0_8_;
          auVar191._0_8_ = auVar45._0_8_;
          auVar43 = vshufpd_avx(auVar142,auVar142,3);
          auVar42 = vshufpd_avx(auVar45,auVar45,3);
          auVar40 = vshufps_avx(auVar39,auVar36,0);
          auVar37 = vsubps_avx512vl(auVar33,auVar40);
          fVar88 = auVar40._0_4_;
          auVar226._0_4_ = fVar88 * auVar46._0_4_;
          fVar197 = auVar40._4_4_;
          auVar226._4_4_ = fVar197 * auVar46._4_4_;
          fVar198 = auVar40._8_4_;
          auVar226._8_4_ = fVar198 * auVar46._8_4_;
          fVar199 = auVar40._12_4_;
          auVar226._12_4_ = fVar199 * auVar46._12_4_;
          auVar143._0_4_ = fVar88 * auVar43._0_4_;
          auVar143._4_4_ = fVar197 * auVar43._4_4_;
          auVar143._8_4_ = fVar198 * auVar43._8_4_;
          auVar143._12_4_ = fVar199 * auVar43._12_4_;
          auVar147._0_4_ = fVar88 * auVar42._0_4_;
          auVar147._4_4_ = fVar197 * auVar42._4_4_;
          auVar147._8_4_ = fVar198 * auVar42._8_4_;
          auVar147._12_4_ = fVar199 * auVar42._12_4_;
          auVar117._0_4_ = fVar88 * auVar34._0_4_;
          auVar117._4_4_ = fVar197 * auVar34._4_4_;
          auVar117._8_4_ = fVar198 * auVar34._8_4_;
          auVar117._12_4_ = fVar199 * auVar34._12_4_;
          auVar38 = vfmadd231ps_fma(auVar226,auVar37,auVar94);
          auVar35 = vfmadd231ps_fma(auVar143,auVar37,auVar183);
          auVar46 = vfmadd231ps_fma(auVar147,auVar37,auVar191);
          auVar34 = vfmadd231ps_fma(auVar117,auVar37,ZEXT816(0));
          auVar42 = vsubss_avx512f(auVar41,auVar39);
          auVar43 = vmovshdup_avx(auVar235);
          auVar101 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * auVar39._0_4_)),auVar235,auVar42
                                    );
          auVar42 = vsubss_avx512f(auVar41,auVar36);
          auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar43._0_4_)),auVar235,auVar42
                                    );
          auVar36 = vdivss_avx512f(auVar41,ZEXT416((uint)fVar202));
          auVar43 = vsubps_avx(auVar35,auVar38);
          auVar104._0_4_ = auVar43._0_4_ * 3.0;
          auVar104._4_4_ = auVar43._4_4_ * 3.0;
          auVar104._8_4_ = auVar43._8_4_ * 3.0;
          auVar104._12_4_ = auVar43._12_4_ * 3.0;
          auVar43 = vsubps_avx(auVar46,auVar35);
          auVar157._0_4_ = auVar43._0_4_ * 3.0;
          auVar157._4_4_ = auVar43._4_4_ * 3.0;
          auVar157._8_4_ = auVar43._8_4_ * 3.0;
          auVar157._12_4_ = auVar43._12_4_ * 3.0;
          auVar43 = vsubps_avx(auVar34,auVar46);
          auVar172._0_4_ = auVar43._0_4_ * 3.0;
          auVar172._4_4_ = auVar43._4_4_ * 3.0;
          auVar172._8_4_ = auVar43._8_4_ * 3.0;
          auVar172._12_4_ = auVar43._12_4_ * 3.0;
          auVar42 = vminps_avx(auVar157,auVar172);
          auVar43 = vmaxps_avx(auVar157,auVar172);
          auVar42 = vminps_avx(auVar104,auVar42);
          auVar43 = vmaxps_avx(auVar104,auVar43);
          auVar40 = vshufpd_avx(auVar42,auVar42,3);
          auVar39 = vshufpd_avx(auVar43,auVar43,3);
          auVar42 = vminps_avx(auVar42,auVar40);
          auVar43 = vmaxps_avx(auVar43,auVar39);
          fVar202 = auVar36._0_4_;
          auVar173._0_4_ = fVar202 * auVar42._0_4_;
          auVar173._4_4_ = fVar202 * auVar42._4_4_;
          auVar173._8_4_ = fVar202 * auVar42._8_4_;
          auVar173._12_4_ = fVar202 * auVar42._12_4_;
          auVar158._0_4_ = fVar202 * auVar43._0_4_;
          auVar158._4_4_ = fVar202 * auVar43._4_4_;
          auVar158._8_4_ = fVar202 * auVar43._8_4_;
          auVar158._12_4_ = fVar202 * auVar43._12_4_;
          auVar36 = vdivss_avx512f(auVar41,ZEXT416((uint)(auVar103._0_4_ - auVar101._0_4_)));
          auVar43 = vshufpd_avx(auVar38,auVar38,3);
          auVar42 = vshufpd_avx(auVar35,auVar35,3);
          auVar40 = vshufpd_avx(auVar46,auVar46,3);
          auVar39 = vshufpd_avx(auVar34,auVar34,3);
          auVar43 = vsubps_avx(auVar43,auVar38);
          auVar38 = vsubps_avx(auVar42,auVar35);
          auVar35 = vsubps_avx(auVar40,auVar46);
          auVar39 = vsubps_avx(auVar39,auVar34);
          auVar42 = vminps_avx(auVar43,auVar38);
          auVar43 = vmaxps_avx(auVar43,auVar38);
          auVar40 = vminps_avx(auVar35,auVar39);
          auVar40 = vminps_avx(auVar42,auVar40);
          auVar42 = vmaxps_avx(auVar35,auVar39);
          auVar43 = vmaxps_avx(auVar43,auVar42);
          fVar202 = auVar36._0_4_;
          auVar192._0_4_ = fVar202 * auVar40._0_4_;
          auVar192._4_4_ = fVar202 * auVar40._4_4_;
          auVar192._8_4_ = fVar202 * auVar40._8_4_;
          auVar192._12_4_ = fVar202 * auVar40._12_4_;
          auVar206._0_4_ = fVar202 * auVar43._0_4_;
          auVar206._4_4_ = fVar202 * auVar43._4_4_;
          auVar206._8_4_ = fVar202 * auVar43._8_4_;
          auVar206._12_4_ = fVar202 * auVar43._12_4_;
          auVar38 = vinsertps_avx(local_2f8,auVar101,0x10);
          auVar35 = vinsertps_avx(auVar44,auVar103,0x10);
          auVar90._0_4_ = auVar38._0_4_ + auVar35._0_4_;
          auVar90._4_4_ = auVar38._4_4_ + auVar35._4_4_;
          auVar90._8_4_ = auVar38._8_4_ + auVar35._8_4_;
          auVar90._12_4_ = auVar38._12_4_ + auVar35._12_4_;
          auVar45 = vmulps_avx512vl(auVar90,auVar238._0_16_);
          auVar40 = vshufps_avx(auVar45,auVar45,0x54);
          uVar89 = auVar45._0_4_;
          auVar105._4_4_ = uVar89;
          auVar105._0_4_ = uVar89;
          auVar105._8_4_ = uVar89;
          auVar105._12_4_ = uVar89;
          auVar46 = vfmadd213ps_avx512vl(auVar245._0_16_,auVar105,auVar246._0_16_);
          auVar42 = vfmadd213ps_fma(auVar248._0_16_,auVar105,local_2d8);
          auVar39 = vfmadd213ps_fma(local_e8,auVar105,local_2e8);
          auVar247 = ZEXT1664(local_2f8);
          auVar43 = vsubps_avx(auVar42,auVar46);
          auVar46 = vfmadd213ps_fma(auVar43,auVar105,auVar46);
          auVar43 = vsubps_avx(auVar39,auVar42);
          auVar43 = vfmadd213ps_fma(auVar43,auVar105,auVar42);
          auVar43 = vsubps_avx(auVar43,auVar46);
          auVar42 = vfmadd231ps_fma(auVar46,auVar43,auVar105);
          auVar106._0_8_ = CONCAT44(auVar43._4_4_ * 3.0,auVar43._0_4_ * 3.0);
          auVar106._8_4_ = auVar43._8_4_ * 3.0;
          auVar106._12_4_ = auVar43._12_4_ * 3.0;
          auVar217._8_8_ = auVar42._0_8_;
          auVar217._0_8_ = auVar42._0_8_;
          auVar43 = vshufpd_avx(auVar42,auVar42,3);
          auVar42 = vshufps_avx(auVar45,auVar45,0x55);
          auVar39 = vsubps_avx(auVar43,auVar217);
          auVar46 = vfmadd231ps_fma(auVar217,auVar42,auVar39);
          auVar231._8_8_ = auVar106._0_8_;
          auVar231._0_8_ = auVar106._0_8_;
          auVar43 = vshufpd_avx(auVar106,auVar106,3);
          auVar43 = vsubps_avx(auVar43,auVar231);
          auVar42 = vfmadd213ps_fma(auVar43,auVar42,auVar231);
          auVar107._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
          auVar107._8_4_ = auVar39._8_4_ ^ 0x80000000;
          auVar107._12_4_ = auVar39._12_4_ ^ 0x80000000;
          auVar43 = vmovshdup_avx(auVar42);
          auVar232._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
          auVar232._8_4_ = auVar43._8_4_ ^ 0x80000000;
          auVar232._12_4_ = auVar43._12_4_ ^ 0x80000000;
          auVar34 = vmovshdup_avx512vl(auVar39);
          auVar36 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar39);
          auVar43 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar39._0_4_)),auVar42,
                                        auVar34);
          auVar42 = vpermt2ps_avx512vl(auVar42,SUB6416(ZEXT464(4),0),auVar107);
          auVar118._0_4_ = auVar43._0_4_;
          auVar118._4_4_ = auVar118._0_4_;
          auVar118._8_4_ = auVar118._0_4_;
          auVar118._12_4_ = auVar118._0_4_;
          auVar43 = vdivps_avx(auVar36,auVar118);
          auVar42 = vdivps_avx(auVar42,auVar118);
          fVar88 = auVar46._0_4_;
          auVar39 = vshufps_avx(auVar46,auVar46,0x55);
          fVar202 = auVar42._0_4_;
          auVar218._0_4_ = fVar88 * auVar43._0_4_ + auVar39._0_4_ * fVar202;
          auVar218._4_4_ = fVar88 * auVar43._4_4_ + auVar39._4_4_ * auVar42._4_4_;
          auVar218._8_4_ = fVar88 * auVar43._8_4_ + auVar39._8_4_ * auVar42._8_4_;
          auVar218._12_4_ = fVar88 * auVar43._12_4_ + auVar39._12_4_ * auVar42._12_4_;
          auVar100 = vsubps_avx(auVar40,auVar218);
          auVar46 = vmovshdup_avx(auVar43);
          auVar40 = vinsertps_avx(auVar173,auVar192,0x1c);
          auVar233._0_4_ = auVar46._0_4_ * auVar40._0_4_;
          auVar233._4_4_ = auVar46._4_4_ * auVar40._4_4_;
          auVar233._8_4_ = auVar46._8_4_ * auVar40._8_4_;
          auVar233._12_4_ = auVar46._12_4_ * auVar40._12_4_;
          auVar39 = vinsertps_avx(auVar158,auVar206,0x1c);
          auVar219._0_4_ = auVar46._0_4_ * auVar39._0_4_;
          auVar219._4_4_ = auVar46._4_4_ * auVar39._4_4_;
          auVar219._8_4_ = auVar46._8_4_ * auVar39._8_4_;
          auVar219._12_4_ = auVar46._12_4_ * auVar39._12_4_;
          auVar47 = vminps_avx512vl(auVar233,auVar219);
          auVar36 = vmaxps_avx(auVar219,auVar233);
          auVar37 = vmovshdup_avx(auVar42);
          auVar46 = vinsertps_avx(auVar192,auVar173,0x4c);
          auVar193._0_4_ = auVar37._0_4_ * auVar46._0_4_;
          auVar193._4_4_ = auVar37._4_4_ * auVar46._4_4_;
          auVar193._8_4_ = auVar37._8_4_ * auVar46._8_4_;
          auVar193._12_4_ = auVar37._12_4_ * auVar46._12_4_;
          auVar34 = vinsertps_avx(auVar206,auVar158,0x4c);
          auVar207._0_4_ = auVar37._0_4_ * auVar34._0_4_;
          auVar207._4_4_ = auVar37._4_4_ * auVar34._4_4_;
          auVar207._8_4_ = auVar37._8_4_ * auVar34._8_4_;
          auVar207._12_4_ = auVar37._12_4_ * auVar34._12_4_;
          auVar37 = vminps_avx(auVar193,auVar207);
          auVar47 = vaddps_avx512vl(auVar47,auVar37);
          auVar37 = vmaxps_avx(auVar207,auVar193);
          auVar194._0_4_ = auVar36._0_4_ + auVar37._0_4_;
          auVar194._4_4_ = auVar36._4_4_ + auVar37._4_4_;
          auVar194._8_4_ = auVar36._8_4_ + auVar37._8_4_;
          auVar194._12_4_ = auVar36._12_4_ + auVar37._12_4_;
          auVar208._8_8_ = 0x3f80000000000000;
          auVar208._0_8_ = 0x3f80000000000000;
          auVar36 = vsubps_avx(auVar208,auVar194);
          auVar37 = vsubps_avx(auVar208,auVar47);
          auVar47 = vsubps_avx(auVar38,auVar45);
          auVar45 = vsubps_avx(auVar35,auVar45);
          fVar200 = auVar47._0_4_;
          auVar234._0_4_ = fVar200 * auVar36._0_4_;
          fVar201 = auVar47._4_4_;
          auVar234._4_4_ = fVar201 * auVar36._4_4_;
          fVar91 = auVar47._8_4_;
          auVar234._8_4_ = fVar91 * auVar36._8_4_;
          fVar113 = auVar47._12_4_;
          auVar234._12_4_ = fVar113 * auVar36._12_4_;
          auVar48 = vbroadcastss_avx512vl(auVar43);
          auVar40 = vmulps_avx512vl(auVar48,auVar40);
          auVar39 = vmulps_avx512vl(auVar48,auVar39);
          auVar48 = vminps_avx512vl(auVar40,auVar39);
          auVar40 = vmaxps_avx(auVar39,auVar40);
          auVar174._0_4_ = fVar202 * auVar46._0_4_;
          auVar174._4_4_ = fVar202 * auVar46._4_4_;
          auVar174._8_4_ = fVar202 * auVar46._8_4_;
          auVar174._12_4_ = fVar202 * auVar46._12_4_;
          auVar159._0_4_ = fVar202 * auVar34._0_4_;
          auVar159._4_4_ = fVar202 * auVar34._4_4_;
          auVar159._8_4_ = fVar202 * auVar34._8_4_;
          auVar159._12_4_ = fVar202 * auVar34._12_4_;
          auVar39 = vminps_avx(auVar174,auVar159);
          auVar46 = vaddps_avx512vl(auVar48,auVar39);
          auVar34 = vmulps_avx512vl(auVar47,auVar37);
          fVar88 = auVar45._0_4_;
          auVar195._0_4_ = fVar88 * auVar36._0_4_;
          fVar197 = auVar45._4_4_;
          auVar195._4_4_ = fVar197 * auVar36._4_4_;
          fVar198 = auVar45._8_4_;
          auVar195._8_4_ = fVar198 * auVar36._8_4_;
          fVar199 = auVar45._12_4_;
          auVar195._12_4_ = fVar199 * auVar36._12_4_;
          auVar209._0_4_ = fVar88 * auVar37._0_4_;
          auVar209._4_4_ = fVar197 * auVar37._4_4_;
          auVar209._8_4_ = fVar198 * auVar37._8_4_;
          auVar209._12_4_ = fVar199 * auVar37._12_4_;
          auVar39 = vmaxps_avx(auVar159,auVar174);
          auVar160._0_4_ = auVar40._0_4_ + auVar39._0_4_;
          auVar160._4_4_ = auVar40._4_4_ + auVar39._4_4_;
          auVar160._8_4_ = auVar40._8_4_ + auVar39._8_4_;
          auVar160._12_4_ = auVar40._12_4_ + auVar39._12_4_;
          auVar175._8_8_ = 0x3f800000;
          auVar175._0_8_ = 0x3f800000;
          auVar40 = vsubps_avx(auVar175,auVar160);
          auVar39 = vsubps_avx(auVar175,auVar46);
          auVar227._0_4_ = fVar200 * auVar40._0_4_;
          auVar227._4_4_ = fVar201 * auVar40._4_4_;
          auVar227._8_4_ = fVar91 * auVar40._8_4_;
          auVar227._12_4_ = fVar113 * auVar40._12_4_;
          auVar220._0_4_ = fVar200 * auVar39._0_4_;
          auVar220._4_4_ = fVar201 * auVar39._4_4_;
          auVar220._8_4_ = fVar91 * auVar39._8_4_;
          auVar220._12_4_ = fVar113 * auVar39._12_4_;
          auVar161._0_4_ = fVar88 * auVar40._0_4_;
          auVar161._4_4_ = fVar197 * auVar40._4_4_;
          auVar161._8_4_ = fVar198 * auVar40._8_4_;
          auVar161._12_4_ = fVar199 * auVar40._12_4_;
          auVar176._0_4_ = fVar88 * auVar39._0_4_;
          auVar176._4_4_ = fVar197 * auVar39._4_4_;
          auVar176._8_4_ = fVar198 * auVar39._8_4_;
          auVar176._12_4_ = fVar199 * auVar39._12_4_;
          auVar40 = vminps_avx(auVar227,auVar220);
          auVar39 = vminps_avx(auVar161,auVar176);
          auVar46 = vminps_avx(auVar40,auVar39);
          auVar40 = vmaxps_avx(auVar220,auVar227);
          auVar39 = vmaxps_avx(auVar176,auVar161);
          auVar39 = vmaxps_avx(auVar39,auVar40);
          auVar36 = vminps_avx512vl(auVar234,auVar34);
          auVar40 = vminps_avx(auVar195,auVar209);
          auVar40 = vminps_avx(auVar36,auVar40);
          auVar40 = vhaddps_avx(auVar46,auVar40);
          auVar36 = vmaxps_avx512vl(auVar34,auVar234);
          auVar46 = vmaxps_avx(auVar209,auVar195);
          auVar46 = vmaxps_avx(auVar46,auVar36);
          auVar39 = vhaddps_avx(auVar39,auVar46);
          auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
          auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
          auVar162._0_4_ = auVar40._0_4_ + auVar100._0_4_;
          auVar162._4_4_ = auVar40._4_4_ + auVar100._4_4_;
          auVar162._8_4_ = auVar40._8_4_ + auVar100._8_4_;
          auVar162._12_4_ = auVar40._12_4_ + auVar100._12_4_;
          auVar177._0_4_ = auVar39._0_4_ + auVar100._0_4_;
          auVar177._4_4_ = auVar39._4_4_ + auVar100._4_4_;
          auVar177._8_4_ = auVar39._8_4_ + auVar100._8_4_;
          auVar177._12_4_ = auVar39._12_4_ + auVar100._12_4_;
          auVar40 = vmaxps_avx(auVar38,auVar162);
          auVar39 = vminps_avx(auVar177,auVar35);
          uVar32 = vcmpps_avx512vl(auVar39,auVar40,1);
          local_298 = vinsertps_avx(auVar101,auVar103,0x10);
          auVar236 = ZEXT1664(local_298);
          if ((uVar32 & 3) == 0) {
            vucomiss_avx512f(local_2f8);
            auVar40 = vxorps_avx512vl(auVar34,auVar34);
            auVar237 = ZEXT1664(auVar40);
            auVar86._0_16_ = local_338;
            auVar246 = ZEXT1664(local_338);
            if ((uint)uVar25 < 4 && (uVar5 == 0 || lVar29 == 0)) {
              bVar10 = false;
            }
            else {
              lVar29 = 200;
              do {
                auVar39 = vsubss_avx512f(auVar41,auVar100);
                fVar198 = auVar39._0_4_;
                fVar88 = fVar198 * fVar198 * fVar198;
                fVar199 = auVar100._0_4_;
                fVar197 = fVar199 * 3.0 * fVar198 * fVar198;
                fVar198 = fVar198 * fVar199 * fVar199 * 3.0;
                auVar144._4_4_ = fVar88;
                auVar144._0_4_ = fVar88;
                auVar144._8_4_ = fVar88;
                auVar144._12_4_ = fVar88;
                auVar131._4_4_ = fVar197;
                auVar131._0_4_ = fVar197;
                auVar131._8_4_ = fVar197;
                auVar131._12_4_ = fVar197;
                auVar95._4_4_ = fVar198;
                auVar95._0_4_ = fVar198;
                auVar95._8_4_ = fVar198;
                auVar95._12_4_ = fVar198;
                fVar199 = fVar199 * fVar199 * fVar199;
                auVar148._0_4_ = (float)local_1f8._0_4_ * fVar199;
                auVar148._4_4_ = (float)local_1f8._4_4_ * fVar199;
                auVar148._8_4_ = fStack_1f0 * fVar199;
                auVar148._12_4_ = fStack_1ec * fVar199;
                auVar39 = vfmadd231ps_fma(auVar148,local_2e8,auVar95);
                auVar39 = vfmadd231ps_fma(auVar39,local_2d8,auVar131);
                auVar39 = vfmadd231ps_avx512vl(auVar39,local_338,auVar144);
                auVar96._8_8_ = auVar39._0_8_;
                auVar96._0_8_ = auVar39._0_8_;
                auVar39 = vshufpd_avx(auVar39,auVar39,3);
                auVar38 = vshufps_avx(auVar100,auVar100,0x55);
                auVar39 = vsubps_avx(auVar39,auVar96);
                auVar38 = vfmadd213ps_fma(auVar39,auVar38,auVar96);
                fVar88 = auVar38._0_4_;
                auVar39 = vshufps_avx(auVar38,auVar38,0x55);
                auVar97._0_4_ = auVar43._0_4_ * fVar88 + fVar202 * auVar39._0_4_;
                auVar97._4_4_ = auVar43._4_4_ * fVar88 + auVar42._4_4_ * auVar39._4_4_;
                auVar97._8_4_ = auVar43._8_4_ * fVar88 + auVar42._8_4_ * auVar39._8_4_;
                auVar97._12_4_ = auVar43._12_4_ * fVar88 + auVar42._12_4_ * auVar39._12_4_;
                auVar100 = vsubps_avx(auVar100,auVar97);
                auVar39 = vandps_avx512vl(auVar38,auVar239._0_16_);
                auVar86._0_16_ = vprolq_avx512vl(auVar39,0x20);
                auVar39 = vmaxss_avx(auVar86._0_16_,auVar39);
                bVar11 = auVar39._0_4_ <= (float)local_208._0_4_;
                if (auVar39._0_4_ < (float)local_208._0_4_) {
                  auVar43 = vucomiss_avx512f(auVar40);
                  if (bVar11) {
                    auVar42 = vucomiss_avx512f(auVar43);
                    auVar241 = ZEXT1664(auVar42);
                    if (bVar11) {
                      vmovshdup_avx(auVar43);
                      auVar42 = vucomiss_avx512f(auVar40);
                      if (bVar11) {
                        auVar41 = vucomiss_avx512f(auVar42);
                        auVar241 = ZEXT1664(auVar41);
                        if (bVar11) {
                          auVar39 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2])
                                                  ,ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]
                                                          ),0x1c);
                          auVar47 = vinsertps_avx(auVar39,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                          aVar1 = (ray->super_RayK<1>).org.field_0;
                          auVar39 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                          auVar39 = vdpps_avx(auVar39,auVar47,0x7f);
                          auVar38 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                          auVar38 = vdpps_avx(auVar38,auVar47,0x7f);
                          auVar35 = vsubps_avx(local_268,(undefined1  [16])aVar1);
                          auVar35 = vdpps_avx(auVar35,auVar47,0x7f);
                          auVar46 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                          auVar46 = vdpps_avx(auVar46,auVar47,0x7f);
                          auVar34 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
                          auVar34 = vdpps_avx(auVar34,auVar47,0x7f);
                          auVar36 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                          auVar36 = vdpps_avx(auVar36,auVar47,0x7f);
                          auVar37 = vsubps_avx(_local_288,(undefined1  [16])aVar1);
                          auVar37 = vdpps_avx(auVar37,auVar47,0x7f);
                          auVar45 = vsubps_avx(_local_248,(undefined1  [16])aVar1);
                          auVar47 = vdpps_avx(auVar45,auVar47,0x7f);
                          auVar45 = vsubss_avx512f(auVar41,auVar42);
                          fVar202 = auVar42._0_4_;
                          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * fVar202)),auVar45
                                                    ,auVar39);
                          auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * fVar202)),auVar45
                                                    ,auVar38);
                          auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ * fVar202)),auVar45
                                                    ,auVar35);
                          auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar47._0_4_)),auVar45
                                                    ,auVar46);
                          auVar86._0_16_ = vsubss_avx512f(auVar41,auVar43);
                          auVar149._0_4_ = auVar86._0_4_;
                          fVar202 = auVar149._0_4_ * auVar149._0_4_ * auVar149._0_4_;
                          fVar198 = auVar43._0_4_;
                          fVar88 = fVar198 * 3.0 * auVar149._0_4_ * auVar149._0_4_;
                          fVar197 = auVar149._0_4_ * fVar198 * fVar198 * 3.0;
                          fVar200 = fVar198 * fVar198 * fVar198;
                          auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar35._0_4_)),
                                                    ZEXT416((uint)fVar197),auVar38);
                          auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar88),auVar39);
                          auVar42 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar202),auVar42);
                          fVar199 = auVar42._0_4_;
                          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar199) &&
                             (fVar201 = (ray->super_RayK<1>).tfar, fVar199 <= fVar201)) {
                            auVar42 = vshufps_avx(auVar43,auVar43,0x55);
                            auVar39 = vsubps_avx512vl(auVar33,auVar42);
                            fVar91 = auVar42._0_4_;
                            auVar184._0_4_ = fVar91 * (float)local_228._0_4_;
                            fVar113 = auVar42._4_4_;
                            auVar184._4_4_ = fVar113 * (float)local_228._4_4_;
                            fVar123 = auVar42._8_4_;
                            auVar184._8_4_ = fVar123 * fStack_220;
                            fVar124 = auVar42._12_4_;
                            auVar184._12_4_ = fVar124 * fStack_21c;
                            auVar196._0_4_ = fVar91 * (float)local_278._0_4_;
                            auVar196._4_4_ = fVar113 * (float)local_278._4_4_;
                            auVar196._8_4_ = fVar123 * fStack_270;
                            auVar196._12_4_ = fVar124 * fStack_26c;
                            auVar210._0_4_ = fVar91 * (float)local_288._0_4_;
                            auVar210._4_4_ = fVar113 * (float)local_288._4_4_;
                            auVar210._8_4_ = fVar123 * fStack_280;
                            auVar210._12_4_ = fVar124 * fStack_27c;
                            auVar163._0_4_ = fVar91 * (float)local_248._0_4_;
                            auVar163._4_4_ = fVar113 * (float)local_248._4_4_;
                            auVar163._8_4_ = fVar123 * fStack_240;
                            auVar163._12_4_ = fVar124 * fStack_23c;
                            auVar33 = vfmadd231ps_fma(auVar184,auVar39,local_218);
                            auVar42 = vfmadd231ps_fma(auVar196,auVar39,local_258);
                            auVar41 = vfmadd231ps_fma(auVar210,auVar39,local_268);
                            auVar39 = vfmadd231ps_fma(auVar163,auVar39,local_238);
                            auVar33 = vsubps_avx(auVar42,auVar33);
                            auVar42 = vsubps_avx(auVar41,auVar42);
                            auVar41 = vsubps_avx(auVar39,auVar41);
                            auVar211._0_4_ = fVar198 * auVar42._0_4_;
                            auVar211._4_4_ = fVar198 * auVar42._4_4_;
                            auVar211._8_4_ = fVar198 * auVar42._8_4_;
                            auVar211._12_4_ = fVar198 * auVar42._12_4_;
                            auVar149._4_4_ = auVar149._0_4_;
                            auVar149._8_4_ = auVar149._0_4_;
                            auVar149._12_4_ = auVar149._0_4_;
                            auVar33 = vfmadd231ps_fma(auVar211,auVar149,auVar33);
                            auVar164._0_4_ = fVar198 * auVar41._0_4_;
                            auVar164._4_4_ = fVar198 * auVar41._4_4_;
                            auVar164._8_4_ = fVar198 * auVar41._8_4_;
                            auVar164._12_4_ = fVar198 * auVar41._12_4_;
                            auVar42 = vfmadd231ps_fma(auVar164,auVar149,auVar42);
                            auVar165._0_4_ = fVar198 * auVar42._0_4_;
                            auVar165._4_4_ = fVar198 * auVar42._4_4_;
                            auVar165._8_4_ = fVar198 * auVar42._8_4_;
                            auVar165._12_4_ = fVar198 * auVar42._12_4_;
                            auVar33 = vfmadd231ps_fma(auVar165,auVar149,auVar33);
                            auVar14._8_4_ = 0x40400000;
                            auVar14._0_8_ = 0x4040000040400000;
                            auVar14._12_4_ = 0x40400000;
                            auVar86._0_16_ = vmulps_avx512vl(auVar33,auVar14);
                            pGVar6 = (context->scene->geometries).items[uVar30].ptr;
                            if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                              auVar145._0_4_ = fVar200 * (float)local_128._0_4_;
                              auVar145._4_4_ = fVar200 * (float)local_128._4_4_;
                              auVar145._8_4_ = fVar200 * fStack_120;
                              auVar145._12_4_ = fVar200 * fStack_11c;
                              auVar132._4_4_ = fVar197;
                              auVar132._0_4_ = fVar197;
                              auVar132._8_4_ = fVar197;
                              auVar132._12_4_ = fVar197;
                              auVar33 = vfmadd132ps_fma(auVar132,auVar145,local_118);
                              auVar119._4_4_ = fVar88;
                              auVar119._0_4_ = fVar88;
                              auVar119._8_4_ = fVar88;
                              auVar119._12_4_ = fVar88;
                              auVar33 = vfmadd132ps_fma(auVar119,auVar33,local_108);
                              auVar108._4_4_ = fVar202;
                              auVar108._0_4_ = fVar202;
                              auVar108._8_4_ = fVar202;
                              auVar108._12_4_ = fVar202;
                              auVar41 = vfmadd132ps_fma(auVar108,auVar33,local_f8);
                              auVar33 = vshufps_avx(auVar41,auVar41,0xc9);
                              auVar42 = vshufps_avx(auVar86._0_16_,auVar86._0_16_,0xc9);
                              auVar109._0_4_ = auVar41._0_4_ * auVar42._0_4_;
                              auVar109._4_4_ = auVar41._4_4_ * auVar42._4_4_;
                              auVar109._8_4_ = auVar41._8_4_ * auVar42._8_4_;
                              auVar109._12_4_ = auVar41._12_4_ * auVar42._12_4_;
                              auVar33 = vfmsub231ps_fma(auVar109,auVar86._0_16_,auVar33);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                (ray->super_RayK<1>).tfar = fVar199;
                                auVar42 = vshufps_avx(auVar33,auVar33,0xe9);
                                uVar12 = vmovlps_avx(auVar42);
                                *(undefined8 *)&(ray->Ng).field_0 = uVar12;
                                (ray->Ng).field_0.field_0.z = auVar33._0_4_;
                                uVar12 = vmovlps_avx(auVar43);
                                ray->u = (float)(int)uVar12;
                                ray->v = (float)(int)((ulong)uVar12 >> 0x20);
                                ray->primID = (uint)local_320;
                                ray->geomID = uVar30;
                                ray->instID[0] = context->user->instID[0];
                                ray->instPrimID[0] = context->user->instPrimID[0];
                              }
                              else {
                                auVar42 = vshufps_avx(auVar33,auVar33,0xe9);
                                local_158 = vmovlps_avx(auVar42);
                                local_150 = auVar33._0_4_;
                                local_14c = vmovlps_avx(auVar43);
                                local_144 = (uint)local_320;
                                local_140 = uVar30;
                                local_13c = context->user->instID[0];
                                local_138 = context->user->instPrimID[0];
                                (ray->super_RayK<1>).tfar = fVar199;
                                local_33c = -1;
                                local_2c8.valid = &local_33c;
                                local_2c8.geometryUserPtr = pGVar6->userPtr;
                                local_2c8.context = context->user;
                                local_2c8.ray = (RTCRayN *)ray;
                                local_2c8.hit = (RTCHitN *)&local_158;
                                local_2c8.N = 1;
                                if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d5fcdd:
                                  auVar33 = auVar237._0_16_;
                                  p_Var7 = context->args->filter;
                                  if (p_Var7 != (RTCFilterFunctionN)0x0) {
                                    if (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                       (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                      (*p_Var7)(&local_2c8);
                                      auVar236 = ZEXT1664(local_298);
                                      auVar248 = ZEXT1664(local_318);
                                      auVar245 = ZEXT1664(local_308);
                                      auVar246 = ZEXT1664(local_338);
                                      auVar33 = vxorps_avx512vl(auVar33,auVar33);
                                      auVar237 = ZEXT1664(auVar33);
                                      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar242 = ZEXT1664(auVar33);
                                      auVar241 = ZEXT464(0x3f800000);
                                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      in_ZMM20 = ZEXT3264(auVar57);
                                      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar240 = ZEXT1664(auVar33);
                                      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar239 = ZEXT1664(auVar33);
                                      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                      auVar238 = ZEXT1664(auVar33);
                                      auVar57 = vbroadcastss_avx512vl(ZEXT416(2));
                                      auVar244 = ZEXT3264(auVar57);
                                      auVar86 = vbroadcastss_avx512vl(ZEXT416(1));
                                      auVar243 = ZEXT3264(auVar86);
                                    }
                                    if (*local_2c8.valid == 0) goto LAB_01d5fe2e;
                                  }
                                  (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).components[0] =
                                       *(float *)local_2c8.hit;
                                  (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.y =
                                       *(float *)(local_2c8.hit + 4);
                                  (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.z =
                                       *(float *)(local_2c8.hit + 8);
                                  *(float *)((long)local_2c8.ray + 0x3c) =
                                       *(float *)(local_2c8.hit + 0xc);
                                  *(float *)((long)local_2c8.ray + 0x40) =
                                       *(float *)(local_2c8.hit + 0x10);
                                  *(float *)((long)local_2c8.ray + 0x44) =
                                       *(float *)(local_2c8.hit + 0x14);
                                  *(float *)((long)local_2c8.ray + 0x48) =
                                       *(float *)(local_2c8.hit + 0x18);
                                  *(float *)((long)local_2c8.ray + 0x4c) =
                                       *(float *)(local_2c8.hit + 0x1c);
                                  *(float *)((long)local_2c8.ray + 0x50) =
                                       *(float *)(local_2c8.hit + 0x20);
                                }
                                else {
                                  (*pGVar6->intersectionFilterN)(&local_2c8);
                                  auVar236 = ZEXT1664(local_298);
                                  auVar248 = ZEXT1664(local_318);
                                  auVar245 = ZEXT1664(local_308);
                                  auVar246 = ZEXT1664(local_338);
                                  auVar33 = vxorps_avx512vl(auVar40,auVar40);
                                  auVar237 = ZEXT1664(auVar33);
                                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar242 = ZEXT1664(auVar33);
                                  auVar241 = ZEXT464(0x3f800000);
                                  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM20 = ZEXT3264(auVar57);
                                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar240 = ZEXT1664(auVar33);
                                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar239 = ZEXT1664(auVar33);
                                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar238 = ZEXT1664(auVar33);
                                  auVar57 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar244 = ZEXT3264(auVar57);
                                  auVar86 = vbroadcastss_avx512vl(ZEXT416(1));
                                  auVar243 = ZEXT3264(auVar86);
                                  if (*local_2c8.valid != 0) goto LAB_01d5fcdd;
LAB_01d5fe2e:
                                  (ray->super_RayK<1>).tfar = fVar201;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar29 = lVar29 + -1;
              } while (lVar29 != 0);
            }
          }
          else {
            auVar33 = vxorps_avx512vl(auVar34,auVar34);
            auVar237 = ZEXT1664(auVar33);
            auVar246 = ZEXT1664(local_338);
            auVar86._0_16_ = local_2f8;
          }
        }
      }
    } while (bVar10);
    auVar33 = vinsertps_avx(local_2f8,auVar44,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }